

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar48 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  int iVar93;
  float fVar94;
  vint4 bi_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined4 uVar97;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  float fVar111;
  float fVar120;
  float fVar121;
  vint4 bi;
  float fVar122;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar143;
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  vint4 ai;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 ai_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  vfloat4 a0_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  float fVar195;
  float fVar208;
  float fVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar210;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar219;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar240;
  float fVar241;
  vfloat4 a0;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar242;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  vfloat4 a0_1;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  int iVar251;
  undefined1 in_ZMM29 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_378;
  undefined8 uStack_370;
  RTCFilterFunctionNArguments local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  uint auStack_2e8 [4];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint uStack_148;
  float afStack_144 [7];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  
  PVar3 = prim[1];
  uVar30 = (ulong)(byte)PVar3;
  fVar94 = *(float *)(prim + uVar30 * 0x19 + 0x12);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar34 = vsubps_avx(auVar34,*(undefined1 (*) [16])(prim + uVar30 * 0x19 + 6));
  auVar57._0_4_ = fVar94 * auVar34._0_4_;
  auVar57._4_4_ = fVar94 * auVar34._4_4_;
  auVar57._8_4_ = fVar94 * auVar34._8_4_;
  auVar57._12_4_ = fVar94 * auVar34._12_4_;
  auVar40._0_4_ = fVar94 * auVar35._0_4_;
  auVar40._4_4_ = fVar94 * auVar35._4_4_;
  auVar40._8_4_ = fVar94 * auVar35._8_4_;
  auVar40._12_4_ = fVar94 * auVar35._12_4_;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 4 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 5 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 6 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 0xb + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar30 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  uVar33 = (ulong)(uint)((int)(uVar30 * 9) * 2);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar33 + uVar30 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  uVar26 = (ulong)(uint)((int)(uVar30 * 5) << 2);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar232._4_4_ = auVar40._0_4_;
  auVar232._0_4_ = auVar40._0_4_;
  auVar232._8_4_ = auVar40._0_4_;
  auVar232._12_4_ = auVar40._0_4_;
  auVar38 = vshufps_avx(auVar40,auVar40,0x55);
  auVar36 = vshufps_avx(auVar40,auVar40,0xaa);
  fVar94 = auVar36._0_4_;
  auVar55._0_4_ = fVar94 * auVar47._0_4_;
  fVar212 = auVar36._4_4_;
  auVar55._4_4_ = fVar212 * auVar47._4_4_;
  fVar195 = auVar36._8_4_;
  auVar55._8_4_ = fVar195 * auVar47._8_4_;
  fVar208 = auVar36._12_4_;
  auVar55._12_4_ = fVar208 * auVar47._12_4_;
  auVar53._0_4_ = auVar44._0_4_ * fVar94;
  auVar53._4_4_ = auVar44._4_4_ * fVar212;
  auVar53._8_4_ = auVar44._8_4_ * fVar195;
  auVar53._12_4_ = auVar44._12_4_ * fVar208;
  auVar41._0_4_ = auVar14._0_4_ * fVar94;
  auVar41._4_4_ = auVar14._4_4_ * fVar212;
  auVar41._8_4_ = auVar14._8_4_ * fVar195;
  auVar41._12_4_ = auVar14._12_4_ * fVar208;
  auVar36 = vfmadd231ps_fma(auVar55,auVar38,auVar35);
  auVar37 = vfmadd231ps_fma(auVar53,auVar38,auVar45);
  auVar38 = vfmadd231ps_fma(auVar41,auVar42,auVar38);
  auVar39 = vfmadd231ps_fma(auVar36,auVar232,auVar34);
  auVar37 = vfmadd231ps_fma(auVar37,auVar232,auVar46);
  auVar40 = vfmadd231ps_fma(auVar38,auVar43,auVar232);
  auVar233._4_4_ = auVar57._0_4_;
  auVar233._0_4_ = auVar57._0_4_;
  auVar233._8_4_ = auVar57._0_4_;
  auVar233._12_4_ = auVar57._0_4_;
  auVar38 = vshufps_avx(auVar57,auVar57,0x55);
  auVar36 = vshufps_avx(auVar57,auVar57,0xaa);
  fVar94 = auVar36._0_4_;
  auVar247._0_4_ = fVar94 * auVar47._0_4_;
  fVar212 = auVar36._4_4_;
  auVar247._4_4_ = fVar212 * auVar47._4_4_;
  fVar195 = auVar36._8_4_;
  auVar247._8_4_ = fVar195 * auVar47._8_4_;
  fVar208 = auVar36._12_4_;
  auVar247._12_4_ = fVar208 * auVar47._12_4_;
  auVar49._0_4_ = auVar44._0_4_ * fVar94;
  auVar49._4_4_ = auVar44._4_4_ * fVar212;
  auVar49._8_4_ = auVar44._8_4_ * fVar195;
  auVar49._12_4_ = auVar44._12_4_ * fVar208;
  auVar54._0_4_ = auVar14._0_4_ * fVar94;
  auVar54._4_4_ = auVar14._4_4_ * fVar212;
  auVar54._8_4_ = auVar14._8_4_ * fVar195;
  auVar54._12_4_ = auVar14._12_4_ * fVar208;
  auVar35 = vfmadd231ps_fma(auVar247,auVar38,auVar35);
  auVar47 = vfmadd231ps_fma(auVar49,auVar38,auVar45);
  auVar45 = vfmadd231ps_fma(auVar54,auVar38,auVar42);
  auVar44 = vfmadd231ps_fma(auVar35,auVar233,auVar34);
  auVar42 = vfmadd231ps_fma(auVar47,auVar233,auVar46);
  auVar64._16_16_ = in_YmmResult._16_16_;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar250 = ZEXT1664(auVar34);
  auVar14 = vfmadd231ps_fma(auVar45,auVar233,auVar43);
  auVar35 = vandps_avx512vl(auVar39,auVar34);
  auVar51._8_4_ = 0x219392ef;
  auVar51._0_8_ = 0x219392ef219392ef;
  auVar51._12_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar35,auVar51,1);
  bVar10 = (bool)((byte)uVar33 & 1);
  auVar36._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._0_4_;
  bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._4_4_;
  bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._8_4_;
  bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._12_4_;
  auVar35 = vandps_avx512vl(auVar37,auVar34);
  uVar33 = vcmpps_avx512vl(auVar35,auVar51,1);
  bVar10 = (bool)((byte)uVar33 & 1);
  auVar39._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._0_4_;
  bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._4_4_;
  bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._8_4_;
  bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar37._12_4_;
  auVar34 = vandps_avx512vl(auVar40,auVar34);
  uVar33 = vcmpps_avx512vl(auVar34,auVar51,1);
  bVar10 = (bool)((byte)uVar33 & 1);
  auVar37._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar40._0_4_;
  bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar40._4_4_;
  bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar40._8_4_;
  bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar40._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar36);
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = &DAT_3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  auVar34 = vfnmadd213ps_fma(auVar36,auVar35,auVar52);
  auVar46 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar39);
  auVar34 = vfnmadd213ps_fma(auVar39,auVar35,auVar52);
  auVar45 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar37);
  auVar34 = vfnmadd213ps_fma(auVar37,auVar35,auVar52);
  auVar43 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar30 * 7 + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar44);
  auVar60._0_4_ = auVar46._0_4_ * auVar34._0_4_;
  auVar60._4_4_ = auVar46._4_4_ * auVar34._4_4_;
  auVar60._8_4_ = auVar46._8_4_ * auVar34._8_4_;
  auVar60._12_4_ = auVar46._12_4_ * auVar34._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar30 * 9 + 6);
  auVar34 = vpmovsxwd_avx(auVar35);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar44);
  auVar36 = vpbroadcastd_avx512vl();
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar35 = vpmovsxwd_avx(auVar47);
  auVar56._0_4_ = auVar46._0_4_ * auVar34._0_4_;
  auVar56._4_4_ = auVar46._4_4_ * auVar34._4_4_;
  auVar56._8_4_ = auVar46._8_4_ * auVar34._8_4_;
  auVar56._12_4_ = auVar46._12_4_ * auVar34._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar30 * -2 + 6);
  auVar34 = vpmovsxwd_avx(auVar46);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar42);
  auVar58._0_4_ = auVar45._0_4_ * auVar34._0_4_;
  auVar58._4_4_ = auVar45._4_4_ * auVar34._4_4_;
  auVar58._8_4_ = auVar45._8_4_ * auVar34._8_4_;
  auVar58._12_4_ = auVar45._12_4_ * auVar34._12_4_;
  auVar34 = vcvtdq2ps_avx(auVar35);
  auVar34 = vsubps_avx(auVar34,auVar42);
  auVar48._0_4_ = auVar45._0_4_ * auVar34._0_4_;
  auVar48._4_4_ = auVar45._4_4_ * auVar34._4_4_;
  auVar48._8_4_ = auVar45._8_4_ * auVar34._8_4_;
  auVar48._12_4_ = auVar45._12_4_ * auVar34._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 + uVar30 + 6);
  auVar34 = vpmovsxwd_avx(auVar45);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar14);
  auVar50._0_4_ = auVar43._0_4_ * auVar34._0_4_;
  auVar50._4_4_ = auVar43._4_4_ * auVar34._4_4_;
  auVar50._8_4_ = auVar43._8_4_ * auVar34._8_4_;
  auVar50._12_4_ = auVar43._12_4_ * auVar34._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar30 * 0x17 + 6);
  auVar34 = vpmovsxwd_avx(auVar44);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar14);
  auVar59._0_4_ = auVar43._0_4_ * auVar34._0_4_;
  auVar59._4_4_ = auVar43._4_4_ * auVar34._4_4_;
  auVar59._8_4_ = auVar43._8_4_ * auVar34._8_4_;
  auVar59._12_4_ = auVar43._12_4_ * auVar34._12_4_;
  auVar34 = vpminsd_avx(auVar60,auVar56);
  auVar35 = vpminsd_avx(auVar58,auVar48);
  auVar34 = vmaxps_avx(auVar34,auVar35);
  auVar35 = vpminsd_avx(auVar50,auVar59);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar43._4_4_ = uVar97;
  auVar43._0_4_ = uVar97;
  auVar43._8_4_ = uVar97;
  auVar43._12_4_ = uVar97;
  auVar35 = vmaxps_avx512vl(auVar35,auVar43);
  auVar34 = vmaxps_avx(auVar34,auVar35);
  auVar42._8_4_ = 0x3f7ffffa;
  auVar42._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar42._12_4_ = 0x3f7ffffa;
  local_2a8 = vmulps_avx512vl(auVar34,auVar42);
  auVar34 = vpmaxsd_avx(auVar60,auVar56);
  auVar35 = vpmaxsd_avx(auVar58,auVar48);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar35 = vpmaxsd_avx(auVar50,auVar59);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar14._4_4_ = uVar97;
  auVar14._0_4_ = uVar97;
  auVar14._8_4_ = uVar97;
  auVar14._12_4_ = uVar97;
  auVar35 = vminps_avx512vl(auVar35,auVar14);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar38._8_4_ = 0x3f800003;
  auVar38._0_8_ = 0x3f8000033f800003;
  auVar38._12_4_ = 0x3f800003;
  auVar34 = vmulps_avx512vl(auVar34,auVar38);
  uVar15 = vcmpps_avx512vl(local_2a8,auVar34,2);
  uVar33 = vpcmpgtd_avx512vl(auVar36,_DAT_01ff0cf0);
  uVar33 = ((byte)uVar15 & 0xf) & uVar33;
  if ((char)uVar33 == '\0') {
    return;
  }
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar253 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar248 = ZEXT1664(auVar34);
  auVar34 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar252 = ZEXT1664(auVar34);
LAB_01b7297e:
  lVar29 = 0;
  for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar32 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar29 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar32].ptr;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar34 = *(undefined1 (*) [16])(_Var9 + uVar26 * (long)pvVar8);
  auVar35 = *(undefined1 (*) [16])(_Var9 + (uVar26 + 1) * (long)pvVar8);
  auVar47 = *(undefined1 (*) [16])(_Var9 + (uVar26 + 2) * (long)pvVar8);
  auVar46 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar26 + 3));
  lVar29 = *(long *)&pGVar6[1].time_range.upper;
  auVar45 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * uVar26);
  auVar44 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar26 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar26 + 2));
  uVar33 = uVar33 - 1 & uVar33;
  auVar42 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar26 + 3));
  if (uVar33 != 0) {
    uVar30 = uVar33 - 1 & uVar33;
    for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    }
    if (uVar30 != 0) {
      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar94 = *(float *)(ray + k * 4 + 0x30);
  auVar53 = auVar253._0_16_;
  auVar36 = vmulps_avx512vl(auVar42,auVar53);
  auVar98._0_12_ = ZEXT812(0);
  auVar98._12_4_ = 0;
  auVar38 = vfmadd213ps_fma(auVar98,auVar43,auVar36);
  auVar99._0_4_ = auVar44._0_4_ + auVar38._0_4_;
  auVar99._4_4_ = auVar44._4_4_ + auVar38._4_4_;
  auVar99._8_4_ = auVar44._8_4_ + auVar38._8_4_;
  auVar99._12_4_ = auVar44._12_4_ + auVar38._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar99,auVar45,auVar53);
  auVar78._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar38 = vmulps_avx512vl(auVar42,auVar78._0_16_);
  auVar59 = auVar248._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar59);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar78._0_16_);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar45,auVar59);
  auVar40 = vmulps_avx512vl(auVar46,auVar53);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar40);
  auVar234._0_4_ = auVar38._0_4_ + auVar35._0_4_;
  auVar234._4_4_ = auVar38._4_4_ + auVar35._4_4_;
  auVar234._8_4_ = auVar38._8_4_ + auVar35._8_4_;
  auVar234._12_4_ = auVar38._12_4_ + auVar35._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar234,auVar34,auVar53);
  auVar41 = vmulps_avx512vl(auVar46,auVar78._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar47,auVar59);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar35,auVar78._0_16_);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar34,auVar59);
  auVar123._0_4_ = auVar43._0_4_ + auVar36._0_4_;
  auVar123._4_4_ = auVar43._4_4_ + auVar36._4_4_;
  auVar123._8_4_ = auVar43._8_4_ + auVar36._8_4_;
  auVar123._12_4_ = auVar43._12_4_ + auVar36._12_4_;
  auVar36 = vfmadd231ps_avx512vl(auVar123,auVar44,auVar78._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar45,auVar53);
  auVar42 = vmulps_avx512vl(auVar42,auVar59);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar78._0_16_,auVar43);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar59,auVar44);
  auVar43 = vfmadd231ps_avx512vl(auVar44,auVar78._0_16_,auVar45);
  auVar187._0_4_ = auVar40._0_4_ + auVar47._0_4_;
  auVar187._4_4_ = auVar40._4_4_ + auVar47._4_4_;
  auVar187._8_4_ = auVar40._8_4_ + auVar47._8_4_;
  auVar187._12_4_ = auVar40._12_4_ + auVar47._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar187,auVar35,auVar78._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar34,auVar53);
  auVar46 = vmulps_avx512vl(auVar46,auVar59);
  auVar47 = vfmadd231ps_avx512vl(auVar46,auVar78._0_16_,auVar47);
  auVar35 = vfnmadd231ps_avx512vl(auVar47,auVar59,auVar35);
  auVar44 = vfmadd231ps_avx512vl(auVar35,auVar78._0_16_,auVar34);
  auVar34 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar111 = auVar39._0_4_;
  auVar152._0_4_ = fVar111 * auVar35._0_4_;
  fVar120 = auVar39._4_4_;
  auVar152._4_4_ = fVar120 * auVar35._4_4_;
  fVar121 = auVar39._8_4_;
  auVar152._8_4_ = fVar121 * auVar35._8_4_;
  fVar122 = auVar39._12_4_;
  auVar152._12_4_ = fVar122 * auVar35._12_4_;
  auVar35 = vfmsub231ps_fma(auVar152,auVar34,auVar38);
  auVar47 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar153._0_4_ = fVar111 * auVar35._0_4_;
  auVar153._4_4_ = fVar120 * auVar35._4_4_;
  auVar153._8_4_ = fVar121 * auVar35._8_4_;
  auVar153._12_4_ = fVar122 * auVar35._12_4_;
  auVar34 = vfmsub231ps_fma(auVar153,auVar34,auVar41);
  auVar46 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar35 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar136 = auVar43._0_4_;
  auVar144._0_4_ = fVar136 * auVar35._0_4_;
  fVar143 = auVar43._4_4_;
  auVar144._4_4_ = fVar143 * auVar35._4_4_;
  fVar210 = auVar43._8_4_;
  auVar144._8_4_ = fVar210 * auVar35._8_4_;
  fVar211 = auVar43._12_4_;
  auVar144._12_4_ = fVar211 * auVar35._12_4_;
  auVar35 = vfmsub231ps_fma(auVar144,auVar34,auVar45);
  auVar45 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar188._0_4_ = auVar35._0_4_ * fVar136;
  auVar188._4_4_ = auVar35._4_4_ * fVar143;
  auVar188._8_4_ = auVar35._8_4_ * fVar210;
  auVar188._12_4_ = auVar35._12_4_ * fVar211;
  auVar35 = vfmsub231ps_fma(auVar188,auVar34,auVar44);
  auVar34 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar44 = vshufps_avx(auVar35,auVar35,0xc9);
  fVar195 = auVar34._0_4_;
  auVar78._16_16_ = auVar64._16_16_;
  auVar75._4_28_ = auVar78._4_28_;
  auVar75._0_4_ = fVar195;
  auVar35 = vrsqrt14ss_avx512f(auVar78._0_16_,auVar75._0_16_);
  fVar212 = auVar35._0_4_;
  auVar42 = vmulss_avx512f(auVar34,ZEXT416(0xbf000000));
  auVar35 = vdpps_avx(auVar47,auVar46,0x7f);
  fVar212 = fVar212 * 1.5 + auVar42._0_4_ * fVar212 * fVar212 * fVar212;
  fVar219 = fVar212 * auVar47._0_4_;
  fVar228 = fVar212 * auVar47._4_4_;
  fVar229 = fVar212 * auVar47._8_4_;
  fVar230 = fVar212 * auVar47._12_4_;
  auVar196._0_4_ = auVar46._0_4_ * fVar195;
  auVar196._4_4_ = auVar46._4_4_ * fVar195;
  auVar196._8_4_ = auVar46._8_4_ * fVar195;
  auVar196._12_4_ = auVar46._12_4_ * fVar195;
  fVar195 = auVar35._0_4_;
  auVar163._0_4_ = fVar195 * auVar47._0_4_;
  auVar163._4_4_ = fVar195 * auVar47._4_4_;
  auVar163._8_4_ = fVar195 * auVar47._8_4_;
  auVar163._12_4_ = fVar195 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar196,auVar163);
  auVar35 = vrcp14ss_avx512f(auVar78._0_16_,auVar75._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar35,ZEXT416(0x40000000));
  fVar208 = auVar35._0_4_ * auVar34._0_4_;
  auVar34 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar209 = auVar34._0_4_;
  auVar76._16_16_ = auVar64._16_16_;
  auVar76._0_16_ = auVar78._0_16_;
  auVar77._4_28_ = auVar76._4_28_;
  auVar77._0_4_ = fVar209;
  auVar35 = vrsqrt14ss_avx512f(auVar78._0_16_,auVar77._0_16_);
  fVar195 = auVar35._0_4_;
  auVar35 = vmulss_avx512f(auVar34,ZEXT416(0xbf000000));
  fVar195 = fVar195 * 1.5 + auVar35._0_4_ * fVar195 * fVar195 * fVar195;
  auVar35 = vdpps_avx(auVar45,auVar44,0x7f);
  fVar231 = fVar195 * auVar45._0_4_;
  fVar240 = fVar195 * auVar45._4_4_;
  fVar241 = fVar195 * auVar45._8_4_;
  fVar242 = fVar195 * auVar45._12_4_;
  auVar154._0_4_ = fVar209 * auVar44._0_4_;
  auVar154._4_4_ = fVar209 * auVar44._4_4_;
  auVar154._8_4_ = fVar209 * auVar44._8_4_;
  auVar154._12_4_ = fVar209 * auVar44._12_4_;
  fVar209 = auVar35._0_4_;
  auVar145._0_4_ = fVar209 * auVar45._0_4_;
  auVar145._4_4_ = fVar209 * auVar45._4_4_;
  auVar145._8_4_ = fVar209 * auVar45._8_4_;
  auVar145._12_4_ = fVar209 * auVar45._12_4_;
  auVar46 = vsubps_avx(auVar154,auVar145);
  auVar35 = vrcp14ss_avx512f(auVar78._0_16_,auVar77._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar35,ZEXT416(0x40000000));
  fVar209 = auVar34._0_4_ * auVar35._0_4_;
  auVar34 = vshufps_avx(auVar37,auVar37,0xff);
  auVar174._0_4_ = fVar219 * auVar34._0_4_;
  auVar174._4_4_ = fVar228 * auVar34._4_4_;
  auVar174._8_4_ = fVar229 * auVar34._8_4_;
  auVar174._12_4_ = fVar230 * auVar34._12_4_;
  local_1e8 = vsubps_avx(auVar37,auVar174);
  auVar35 = vshufps_avx(auVar39,auVar39,0xff);
  auVar155._0_4_ = auVar35._0_4_ * fVar219 + auVar34._0_4_ * fVar212 * fVar208 * auVar47._0_4_;
  auVar155._4_4_ = auVar35._4_4_ * fVar228 + auVar34._4_4_ * fVar212 * fVar208 * auVar47._4_4_;
  auVar155._8_4_ = auVar35._8_4_ * fVar229 + auVar34._8_4_ * fVar212 * fVar208 * auVar47._8_4_;
  auVar155._12_4_ = auVar35._12_4_ * fVar230 + auVar34._12_4_ * fVar212 * fVar208 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar39,auVar155);
  local_1f8._0_4_ = auVar174._0_4_ + auVar37._0_4_;
  local_1f8._4_4_ = auVar174._4_4_ + auVar37._4_4_;
  fStack_1f0 = auVar174._8_4_ + auVar37._8_4_;
  fStack_1ec = auVar174._12_4_ + auVar37._12_4_;
  auVar34 = vshufps_avx(auVar36,auVar36,0xff);
  auVar156._0_4_ = fVar231 * auVar34._0_4_;
  auVar156._4_4_ = fVar240 * auVar34._4_4_;
  auVar156._8_4_ = fVar241 * auVar34._8_4_;
  auVar156._12_4_ = fVar242 * auVar34._12_4_;
  local_208 = vsubps_avx512vl(auVar36,auVar156);
  auVar35 = vshufps_avx(auVar43,auVar43,0xff);
  auVar112._0_4_ = auVar35._0_4_ * fVar231 + auVar34._0_4_ * fVar195 * auVar46._0_4_ * fVar209;
  auVar112._4_4_ = auVar35._4_4_ * fVar240 + auVar34._4_4_ * fVar195 * auVar46._4_4_ * fVar209;
  auVar112._8_4_ = auVar35._8_4_ * fVar241 + auVar34._8_4_ * fVar195 * auVar46._8_4_ * fVar209;
  auVar112._12_4_ = auVar35._12_4_ * fVar242 + auVar34._12_4_ * fVar195 * auVar46._12_4_ * fVar209;
  auVar34 = vsubps_avx(auVar43,auVar112);
  local_218._0_4_ = auVar36._0_4_ + auVar156._0_4_;
  local_218._4_4_ = auVar36._4_4_ + auVar156._4_4_;
  fStack_210 = auVar36._8_4_ + auVar156._8_4_;
  fStack_20c = auVar36._12_4_ + auVar156._12_4_;
  auVar124._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar124._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar124._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar124._12_4_ = auVar47._12_4_ * 0.33333334;
  local_228 = vaddps_avx512vl(local_1e8,auVar124);
  auVar125._0_4_ = auVar34._0_4_ * 0.33333334;
  auVar125._4_4_ = auVar34._4_4_ * 0.33333334;
  auVar125._8_4_ = auVar34._8_4_ * 0.33333334;
  auVar125._12_4_ = auVar34._12_4_ * 0.33333334;
  local_238 = vsubps_avx512vl(local_208,auVar125);
  auVar100._0_4_ = (fVar111 + auVar155._0_4_) * 0.33333334;
  auVar100._4_4_ = (fVar120 + auVar155._4_4_) * 0.33333334;
  auVar100._8_4_ = (fVar121 + auVar155._8_4_) * 0.33333334;
  auVar100._12_4_ = (fVar122 + auVar155._12_4_) * 0.33333334;
  _local_248 = vaddps_avx512vl(_local_1f8,auVar100);
  auVar101._0_4_ = (fVar136 + auVar112._0_4_) * 0.33333334;
  auVar101._4_4_ = (fVar143 + auVar112._4_4_) * 0.33333334;
  auVar101._8_4_ = (fVar210 + auVar112._8_4_) * 0.33333334;
  auVar101._12_4_ = (fVar211 + auVar112._12_4_) * 0.33333334;
  _local_258 = vsubps_avx512vl(_local_218,auVar101);
  local_168 = vsubps_avx(local_1e8,auVar14);
  uVar97 = local_168._0_4_;
  auVar113._4_4_ = uVar97;
  auVar113._0_4_ = uVar97;
  auVar113._8_4_ = uVar97;
  auVar113._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_168,local_168,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar35 = vshufps_avx(local_168,local_168,0xaa);
  fVar212 = pre->ray_space[k].vz.field_0.m128[0];
  fVar195 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar102._0_4_ = fVar212 * auVar35._0_4_;
  auVar102._4_4_ = fVar195 * auVar35._4_4_;
  auVar102._8_4_ = fVar208 * auVar35._8_4_;
  auVar102._12_4_ = fVar209 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar2,auVar34);
  auVar43 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar113);
  local_178 = vsubps_avx512vl(local_228,auVar14);
  uVar97 = local_178._0_4_;
  auVar126._4_4_ = uVar97;
  auVar126._0_4_ = uVar97;
  auVar126._8_4_ = uVar97;
  auVar126._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_178,local_178,0x55);
  auVar35 = vshufps_avx(local_178,local_178,0xaa);
  auVar114._0_4_ = fVar212 * auVar35._0_4_;
  auVar114._4_4_ = fVar195 * auVar35._4_4_;
  auVar114._8_4_ = fVar208 * auVar35._8_4_;
  auVar114._12_4_ = fVar209 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar2,auVar34);
  auVar42 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar126);
  local_188 = vsubps_avx512vl(local_238,auVar14);
  uVar97 = local_188._0_4_;
  auVar157._4_4_ = uVar97;
  auVar157._0_4_ = uVar97;
  auVar157._8_4_ = uVar97;
  auVar157._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_188,local_188,0x55);
  auVar35 = vshufps_avx(local_188,local_188,0xaa);
  auVar127._0_4_ = fVar212 * auVar35._0_4_;
  auVar127._4_4_ = fVar195 * auVar35._4_4_;
  auVar127._8_4_ = fVar208 * auVar35._8_4_;
  auVar127._12_4_ = fVar209 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar2,auVar34);
  auVar38 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar157);
  local_198 = vsubps_avx512vl(local_208,auVar14);
  uVar97 = local_198._0_4_;
  auVar175._4_4_ = uVar97;
  auVar175._0_4_ = uVar97;
  auVar175._8_4_ = uVar97;
  auVar175._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_198,local_198,0x55);
  auVar35 = vshufps_avx(local_198,local_198,0xaa);
  auVar158._0_4_ = fVar212 * auVar35._0_4_;
  auVar158._4_4_ = fVar195 * auVar35._4_4_;
  auVar158._8_4_ = fVar208 * auVar35._8_4_;
  auVar158._12_4_ = fVar209 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar2,auVar34);
  auVar36 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar175);
  local_1a8 = vsubps_avx(_local_1f8,auVar14);
  uVar97 = local_1a8._0_4_;
  auVar176._4_4_ = uVar97;
  auVar176._0_4_ = uVar97;
  auVar176._8_4_ = uVar97;
  auVar176._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar35 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar197._0_4_ = auVar35._0_4_ * fVar212;
  auVar197._4_4_ = auVar35._4_4_ * fVar195;
  auVar197._8_4_ = auVar35._8_4_ * fVar208;
  auVar197._12_4_ = auVar35._12_4_ * fVar209;
  auVar34 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar34);
  auVar37 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar176);
  local_1b8 = vsubps_avx512vl(_local_248,auVar14);
  uVar97 = local_1b8._0_4_;
  auVar177._4_4_ = uVar97;
  auVar177._0_4_ = uVar97;
  auVar177._8_4_ = uVar97;
  auVar177._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar35 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar213._0_4_ = auVar35._0_4_ * fVar212;
  auVar213._4_4_ = auVar35._4_4_ * fVar195;
  auVar213._8_4_ = auVar35._8_4_ * fVar208;
  auVar213._12_4_ = auVar35._12_4_ * fVar209;
  auVar34 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar2,auVar34);
  auVar39 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar177);
  local_1c8 = vsubps_avx512vl(_local_258,auVar14);
  uVar97 = local_1c8._0_4_;
  auVar178._4_4_ = uVar97;
  auVar178._0_4_ = uVar97;
  auVar178._8_4_ = uVar97;
  auVar178._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar35 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar220._0_4_ = auVar35._0_4_ * fVar212;
  auVar220._4_4_ = auVar35._4_4_ * fVar195;
  auVar220._8_4_ = auVar35._8_4_ * fVar208;
  auVar220._12_4_ = auVar35._12_4_ * fVar209;
  auVar34 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar34);
  auVar40 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar178);
  local_1d8 = vsubps_avx(_local_218,auVar14);
  uVar97 = local_1d8._0_4_;
  auVar95._4_4_ = uVar97;
  auVar95._0_4_ = uVar97;
  auVar95._8_4_ = uVar97;
  auVar95._12_4_ = uVar97;
  auVar34 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar35 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar164._0_4_ = auVar35._0_4_ * fVar212;
  auVar164._4_4_ = auVar35._4_4_ * fVar195;
  auVar164._8_4_ = auVar35._8_4_ * fVar208;
  auVar164._12_4_ = auVar35._12_4_ * fVar209;
  auVar34 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar2,auVar34);
  auVar14 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar95);
  auVar47 = vmovlhps_avx(auVar43,auVar37);
  auVar46 = vmovlhps_avx(auVar42,auVar39);
  auVar44 = vmovlhps_avx512f(auVar38,auVar40);
  _local_328 = vmovlhps_avx512f(auVar36,auVar14);
  auVar35 = vminps_avx(auVar47,auVar46);
  auVar34 = vmaxps_avx(auVar47,auVar46);
  auVar45 = vminps_avx512vl(auVar44,_local_328);
  auVar35 = vminps_avx(auVar35,auVar45);
  auVar45 = vmaxps_avx512vl(auVar44,_local_328);
  auVar34 = vmaxps_avx(auVar34,auVar45);
  auVar45 = vshufpd_avx(auVar35,auVar35,3);
  auVar35 = vminps_avx(auVar35,auVar45);
  auVar45 = vshufpd_avx(auVar34,auVar34,3);
  auVar34 = vmaxps_avx(auVar34,auVar45);
  auVar35 = vandps_avx512vl(auVar35,auVar250._0_16_);
  auVar34 = vandps_avx512vl(auVar34,auVar250._0_16_);
  auVar34 = vmaxps_avx(auVar35,auVar34);
  auVar35 = vmovshdup_avx(auVar34);
  auVar34 = vmaxss_avx(auVar35,auVar34);
  local_2f8 = vmovddup_avx512vl(auVar43);
  local_308 = vmovddup_avx512vl(auVar42);
  local_318 = vmovddup_avx512vl(auVar38);
  auVar103._8_8_ = auVar36._0_8_;
  auVar103._0_8_ = auVar36._0_8_;
  local_338 = ZEXT416((uint)(auVar34._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_338);
  auVar34 = vxorps_avx512vl(local_78._0_16_,auVar53);
  local_98 = vbroadcastss_avx512vl(auVar34);
  uVar26 = 0;
  auVar34 = vsubps_avx(auVar46,auVar47);
  auVar45 = vsubps_avx512vl(auVar44,auVar46);
  local_158 = vsubps_avx512vl(_local_328,auVar44);
  local_268 = vsubps_avx(_local_1f8,local_1e8);
  local_278 = vsubps_avx512vl(_local_248,local_228);
  local_288 = vsubps_avx512vl(_local_258,local_238);
  _local_298 = vsubps_avx512vl(_local_218,local_208);
  local_2b8 = vpbroadcastd_avx512vl();
  local_2c8 = vpbroadcastd_avx512vl();
  auVar35 = ZEXT816(0x3f80000000000000);
  auVar194 = ZEXT1664(auVar35);
  do {
    auVar53 = auVar194._0_16_;
    auVar43 = vshufps_avx(auVar53,auVar53,0x50);
    auVar235._8_4_ = 0x3f800000;
    auVar235._0_8_ = &DAT_3f8000003f800000;
    auVar235._12_4_ = 0x3f800000;
    auVar133._16_4_ = 0x3f800000;
    auVar133._0_16_ = auVar235;
    auVar133._20_4_ = 0x3f800000;
    auVar133._24_4_ = 0x3f800000;
    auVar133._28_4_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar235,auVar43);
    fVar212 = auVar43._0_4_;
    fVar228 = auVar37._0_4_;
    auVar128._0_4_ = fVar228 * fVar212;
    fVar195 = auVar43._4_4_;
    fVar229 = auVar37._4_4_;
    auVar128._4_4_ = fVar229 * fVar195;
    fVar208 = auVar43._8_4_;
    auVar128._8_4_ = fVar228 * fVar208;
    fVar209 = auVar43._12_4_;
    auVar128._12_4_ = fVar229 * fVar209;
    fVar111 = auVar39._0_4_;
    auVar137._0_4_ = fVar111 * fVar212;
    fVar120 = auVar39._4_4_;
    auVar137._4_4_ = fVar120 * fVar195;
    auVar137._8_4_ = fVar111 * fVar208;
    auVar137._12_4_ = fVar120 * fVar209;
    fVar121 = auVar40._0_4_;
    auVar146._0_4_ = fVar121 * fVar212;
    fVar122 = auVar40._4_4_;
    auVar146._4_4_ = fVar122 * fVar195;
    auVar146._8_4_ = fVar121 * fVar208;
    auVar146._12_4_ = fVar122 * fVar209;
    fVar136 = auVar14._0_4_;
    auVar104._0_4_ = fVar136 * fVar212;
    fVar143 = auVar14._4_4_;
    auVar104._4_4_ = fVar143 * fVar195;
    auVar104._8_4_ = fVar136 * fVar208;
    auVar104._12_4_ = fVar143 * fVar209;
    auVar38 = vfmadd231ps_avx512vl(auVar128,auVar42,local_2f8);
    auVar36 = vfmadd231ps_avx512vl(auVar137,auVar42,local_308);
    auVar64._16_16_ = vfmadd231ps_avx512vl(auVar146,auVar42,local_318);
    auVar42 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar42);
    auVar43 = vmovshdup_avx(auVar35);
    fVar195 = auVar35._0_4_;
    fVar212 = (auVar43._0_4_ - fVar195) * 0.04761905;
    auVar74._4_4_ = fVar195;
    auVar74._0_4_ = fVar195;
    auVar74._8_4_ = fVar195;
    auVar74._12_4_ = fVar195;
    auVar74._16_4_ = fVar195;
    auVar74._20_4_ = fVar195;
    auVar74._24_4_ = fVar195;
    auVar74._28_4_ = fVar195;
    auVar69._0_8_ = auVar43._0_8_;
    auVar69._8_8_ = auVar69._0_8_;
    auVar69._16_8_ = auVar69._0_8_;
    auVar69._24_8_ = auVar69._0_8_;
    auVar78 = vsubps_avx(auVar69,auVar74);
    uVar97 = auVar38._0_4_;
    auVar80._4_4_ = uVar97;
    auVar80._0_4_ = uVar97;
    auVar80._8_4_ = uVar97;
    auVar80._12_4_ = uVar97;
    auVar80._16_4_ = uVar97;
    auVar80._20_4_ = uVar97;
    auVar80._24_4_ = uVar97;
    auVar80._28_4_ = uVar97;
    auVar70._8_4_ = 1;
    auVar70._0_8_ = 0x100000001;
    auVar70._12_4_ = 1;
    auVar70._16_4_ = 1;
    auVar70._20_4_ = 1;
    auVar70._24_4_ = 1;
    auVar70._28_4_ = 1;
    auVar76 = ZEXT1632(auVar38);
    auVar75 = vpermps_avx2(auVar70,auVar76);
    auVar61 = vbroadcastss_avx512vl(auVar36);
    auVar77 = ZEXT1632(auVar36);
    auVar62 = vpermps_avx512vl(auVar70,auVar77);
    auVar63 = vbroadcastss_avx512vl(auVar64._16_16_);
    auVar71 = ZEXT1632(auVar64._16_16_);
    auVar64 = vpermps_avx512vl(auVar70,auVar71);
    auVar65 = vbroadcastss_avx512vl(auVar42);
    auVar73 = ZEXT1632(auVar42);
    auVar66 = vpermps_avx512vl(auVar70,auVar73);
    auVar81._4_4_ = fVar212;
    auVar81._0_4_ = fVar212;
    auVar81._8_4_ = fVar212;
    auVar81._12_4_ = fVar212;
    auVar81._16_4_ = fVar212;
    auVar81._20_4_ = fVar212;
    auVar81._24_4_ = fVar212;
    auVar81._28_4_ = fVar212;
    auVar72._8_4_ = 2;
    auVar72._0_8_ = 0x200000002;
    auVar72._12_4_ = 2;
    auVar72._16_4_ = 2;
    auVar72._20_4_ = 2;
    auVar72._24_4_ = 2;
    auVar72._28_4_ = 2;
    auVar67 = vpermps_avx512vl(auVar72,auVar76);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar69 = vpermps_avx512vl(auVar68,auVar76);
    auVar76 = vpermps_avx2(auVar72,auVar77);
    auVar70 = vpermps_avx512vl(auVar68,auVar77);
    auVar77 = vpermps_avx2(auVar72,auVar71);
    auVar71 = vpermps_avx512vl(auVar68,auVar71);
    auVar72 = vpermps_avx512vl(auVar72,auVar73);
    auVar68 = vpermps_avx512vl(auVar68,auVar73);
    auVar43 = vfmadd132ps_fma(auVar78,auVar74,_DAT_02020f20);
    auVar78 = vsubps_avx(auVar133,ZEXT1632(auVar43));
    auVar73 = vmulps_avx512vl(auVar61,ZEXT1632(auVar43));
    auVar79 = ZEXT1632(auVar43);
    auVar74 = vmulps_avx512vl(auVar62,auVar79);
    auVar42 = vfmadd231ps_fma(auVar73,auVar78,auVar80);
    auVar38 = vfmadd231ps_fma(auVar74,auVar78,auVar75);
    auVar73 = vmulps_avx512vl(auVar63,auVar79);
    auVar74 = vmulps_avx512vl(auVar64,auVar79);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar61);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar78,auVar62);
    auVar61 = vmulps_avx512vl(auVar65,auVar79);
    auVar80 = ZEXT1632(auVar43);
    auVar62 = vmulps_avx512vl(auVar66,auVar80);
    auVar66 = vfmadd231ps_avx512vl(auVar61,auVar78,auVar63);
    auVar64 = vfmadd231ps_avx512vl(auVar62,auVar78,auVar64);
    fVar208 = auVar43._0_4_;
    fVar209 = auVar43._4_4_;
    auVar61._4_4_ = fVar209 * auVar73._4_4_;
    auVar61._0_4_ = fVar208 * auVar73._0_4_;
    fVar210 = auVar43._8_4_;
    auVar61._8_4_ = fVar210 * auVar73._8_4_;
    fVar211 = auVar43._12_4_;
    auVar61._12_4_ = fVar211 * auVar73._12_4_;
    auVar61._16_4_ = auVar73._16_4_ * 0.0;
    auVar61._20_4_ = auVar73._20_4_ * 0.0;
    auVar61._24_4_ = auVar73._24_4_ * 0.0;
    auVar61._28_4_ = fVar195;
    auVar62._4_4_ = fVar209 * auVar74._4_4_;
    auVar62._0_4_ = fVar208 * auVar74._0_4_;
    auVar62._8_4_ = fVar210 * auVar74._8_4_;
    auVar62._12_4_ = fVar211 * auVar74._12_4_;
    auVar62._16_4_ = auVar74._16_4_ * 0.0;
    auVar62._20_4_ = auVar74._20_4_ * 0.0;
    auVar62._24_4_ = auVar74._24_4_ * 0.0;
    auVar62._28_4_ = auVar75._28_4_;
    auVar42 = vfmadd231ps_fma(auVar61,auVar78,ZEXT1632(auVar42));
    auVar38 = vfmadd231ps_fma(auVar62,auVar78,ZEXT1632(auVar38));
    auVar79._0_4_ = fVar208 * auVar66._0_4_;
    auVar79._4_4_ = fVar209 * auVar66._4_4_;
    auVar79._8_4_ = fVar210 * auVar66._8_4_;
    auVar79._12_4_ = fVar211 * auVar66._12_4_;
    auVar79._16_4_ = auVar66._16_4_ * 0.0;
    auVar79._20_4_ = auVar66._20_4_ * 0.0;
    auVar79._24_4_ = auVar66._24_4_ * 0.0;
    auVar79._28_4_ = 0;
    auVar63._4_4_ = fVar209 * auVar64._4_4_;
    auVar63._0_4_ = fVar208 * auVar64._0_4_;
    auVar63._8_4_ = fVar210 * auVar64._8_4_;
    auVar63._12_4_ = fVar211 * auVar64._12_4_;
    auVar63._16_4_ = auVar64._16_4_ * 0.0;
    auVar63._20_4_ = auVar64._20_4_ * 0.0;
    auVar63._24_4_ = auVar64._24_4_ * 0.0;
    auVar63._28_4_ = auVar66._28_4_;
    auVar36 = vfmadd231ps_fma(auVar79,auVar78,auVar73);
    auVar64._16_16_ = vfmadd231ps_fma(auVar63,auVar78,auVar74);
    auVar66._28_4_ = auVar74._28_4_;
    auVar66._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * auVar64._28_4_,
                            CONCAT48(fVar210 * auVar64._24_4_,
                                     CONCAT44(fVar209 * auVar64._20_4_,fVar208 * auVar64._16_4_))));
    auVar41 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar36._12_4_,
                                                 CONCAT48(fVar210 * auVar36._8_4_,
                                                          CONCAT44(fVar209 * auVar36._4_4_,
                                                                   fVar208 * auVar36._0_4_)))),
                              auVar78,ZEXT1632(auVar42));
    auVar59 = vfmadd231ps_fma(auVar66,auVar78,ZEXT1632(auVar38));
    auVar75 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar42));
    auVar64 = vsubps_avx(ZEXT1632(auVar64._16_16_),ZEXT1632(auVar38));
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar75 = vmulps_avx512vl(auVar75,auVar61);
    auVar64 = vmulps_avx512vl(auVar64,auVar61);
    auVar73._0_4_ = fVar212 * auVar75._0_4_;
    auVar73._4_4_ = fVar212 * auVar75._4_4_;
    auVar73._8_4_ = fVar212 * auVar75._8_4_;
    auVar73._12_4_ = fVar212 * auVar75._12_4_;
    auVar73._16_4_ = fVar212 * auVar75._16_4_;
    auVar73._20_4_ = fVar212 * auVar75._20_4_;
    auVar73._24_4_ = fVar212 * auVar75._24_4_;
    auVar73._28_4_ = 0;
    auVar64 = vmulps_avx512vl(auVar81,auVar64);
    auVar36 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_0205fd20,ZEXT1632(auVar36));
    auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar59),_DAT_0205fd20,ZEXT1632(auVar36));
    auVar110._0_4_ = auVar73._0_4_ + auVar41._0_4_;
    auVar110._4_4_ = auVar73._4_4_ + auVar41._4_4_;
    auVar110._8_4_ = auVar73._8_4_ + auVar41._8_4_;
    auVar110._12_4_ = auVar73._12_4_ + auVar41._12_4_;
    auVar110._16_4_ = auVar73._16_4_ + 0.0;
    auVar110._20_4_ = auVar73._20_4_ + 0.0;
    auVar110._24_4_ = auVar73._24_4_ + 0.0;
    auVar110._28_4_ = 0;
    auVar74 = ZEXT1632(auVar36);
    auVar63 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar74);
    auVar66 = vaddps_avx512vl(ZEXT1632(auVar59),auVar64);
    auVar65 = vpermt2ps_avx512vl(auVar64,_DAT_0205fd20,auVar74);
    auVar64 = vsubps_avx(auVar75,auVar63);
    auVar63 = vsubps_avx512vl(auVar62,auVar65);
    auVar65 = vmulps_avx512vl(auVar76,auVar80);
    auVar73 = vmulps_avx512vl(auVar70,auVar80);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar78,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar69);
    auVar69 = vmulps_avx512vl(auVar77,auVar80);
    auVar73 = vmulps_avx512vl(auVar71,auVar80);
    auVar76 = vfmadd231ps_avx512vl(auVar69,auVar78,auVar76);
    auVar69 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar70);
    auVar70 = vmulps_avx512vl(auVar72,auVar80);
    auVar68 = vmulps_avx512vl(auVar68,auVar80);
    auVar42 = vfmadd231ps_fma(auVar70,auVar78,auVar77);
    auVar38 = vfmadd231ps_fma(auVar68,auVar78,auVar71);
    auVar68 = vmulps_avx512vl(auVar80,auVar76);
    auVar70 = vmulps_avx512vl(ZEXT1632(auVar43),auVar69);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar78,auVar65);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar78,auVar67);
    auVar76 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar42._12_4_,
                                            CONCAT48(fVar210 * auVar42._8_4_,
                                                     CONCAT44(fVar209 * auVar42._4_4_,
                                                              fVar208 * auVar42._0_4_)))),auVar78,
                         auVar76);
    auVar69 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar38._12_4_,
                                            CONCAT48(fVar210 * auVar38._8_4_,
                                                     CONCAT44(fVar209 * auVar38._4_4_,
                                                              fVar208 * auVar38._0_4_)))),auVar78,
                         auVar69);
    auVar65._4_4_ = fVar209 * auVar76._4_4_;
    auVar65._0_4_ = fVar208 * auVar76._0_4_;
    auVar65._8_4_ = fVar210 * auVar76._8_4_;
    auVar65._12_4_ = fVar211 * auVar76._12_4_;
    auVar65._16_4_ = auVar76._16_4_ * 0.0;
    auVar65._20_4_ = auVar76._20_4_ * 0.0;
    auVar65._24_4_ = auVar76._24_4_ * 0.0;
    auVar65._28_4_ = auVar71._28_4_;
    auVar67._4_4_ = fVar209 * auVar69._4_4_;
    auVar67._0_4_ = fVar208 * auVar69._0_4_;
    auVar67._8_4_ = fVar210 * auVar69._8_4_;
    auVar67._12_4_ = fVar211 * auVar69._12_4_;
    auVar67._16_4_ = auVar69._16_4_ * 0.0;
    auVar67._20_4_ = auVar69._20_4_ * 0.0;
    auVar67._24_4_ = auVar69._24_4_ * 0.0;
    auVar67._28_4_ = auVar77._28_4_;
    auVar77 = vfmadd231ps_avx512vl(auVar65,auVar78,auVar68);
    auVar65 = vfmadd231ps_avx512vl(auVar67,auVar70,auVar78);
    auVar78 = vsubps_avx512vl(auVar76,auVar68);
    auVar76 = vsubps_avx512vl(auVar69,auVar70);
    auVar78 = vmulps_avx512vl(auVar78,auVar61);
    auVar76 = vmulps_avx512vl(auVar76,auVar61);
    fVar195 = fVar212 * auVar78._0_4_;
    fVar208 = fVar212 * auVar78._4_4_;
    auVar68._4_4_ = fVar208;
    auVar68._0_4_ = fVar195;
    fVar209 = fVar212 * auVar78._8_4_;
    auVar68._8_4_ = fVar209;
    fVar210 = fVar212 * auVar78._12_4_;
    auVar68._12_4_ = fVar210;
    fVar211 = fVar212 * auVar78._16_4_;
    auVar68._16_4_ = fVar211;
    fVar219 = fVar212 * auVar78._20_4_;
    auVar68._20_4_ = fVar219;
    fVar212 = fVar212 * auVar78._24_4_;
    auVar68._24_4_ = fVar212;
    auVar68._28_4_ = auVar78._28_4_;
    auVar76 = vmulps_avx512vl(auVar81,auVar76);
    auVar61 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,auVar74);
    auVar67 = vpermt2ps_avx512vl(auVar65,_DAT_0205fd20,auVar74);
    auVar193._0_4_ = auVar77._0_4_ + fVar195;
    auVar193._4_4_ = auVar77._4_4_ + fVar208;
    auVar193._8_4_ = auVar77._8_4_ + fVar209;
    auVar193._12_4_ = auVar77._12_4_ + fVar210;
    auVar193._16_4_ = auVar77._16_4_ + fVar211;
    auVar193._20_4_ = auVar77._20_4_ + fVar219;
    auVar193._24_4_ = auVar77._24_4_ + fVar212;
    auVar193._28_4_ = auVar77._28_4_ + auVar78._28_4_;
    auVar78 = vpermt2ps_avx512vl(auVar68,_DAT_0205fd20,ZEXT1632(auVar36));
    auVar68 = vaddps_avx512vl(auVar65,auVar76);
    auVar76 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,ZEXT1632(auVar36));
    auVar78 = vsubps_avx(auVar61,auVar78);
    auVar76 = vsubps_avx512vl(auVar67,auVar76);
    auVar133 = ZEXT1632(auVar41);
    auVar69 = vsubps_avx512vl(auVar77,auVar133);
    auVar134 = ZEXT1632(auVar59);
    auVar70 = vsubps_avx512vl(auVar65,auVar134);
    auVar71 = vsubps_avx512vl(auVar61,auVar75);
    auVar69 = vaddps_avx512vl(auVar69,auVar71);
    auVar71 = vsubps_avx512vl(auVar67,auVar62);
    auVar70 = vaddps_avx512vl(auVar70,auVar71);
    auVar71 = vmulps_avx512vl(auVar134,auVar69);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar133,auVar70);
    auVar72 = vmulps_avx512vl(auVar66,auVar69);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar110,auVar70);
    auVar73 = vmulps_avx512vl(auVar63,auVar69);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar64,auVar70);
    auVar74 = vmulps_avx512vl(auVar62,auVar69);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar75,auVar70);
    auVar79 = vmulps_avx512vl(auVar65,auVar69);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar77,auVar70);
    auVar80 = vmulps_avx512vl(auVar68,auVar69);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar193,auVar70);
    auVar81 = vmulps_avx512vl(auVar76,auVar69);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar78,auVar70);
    auVar69 = vmulps_avx512vl(auVar67,auVar69);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar61,auVar70);
    auVar70 = vminps_avx512vl(auVar71,auVar72);
    auVar71 = vmaxps_avx512vl(auVar71,auVar72);
    auVar72 = vminps_avx512vl(auVar73,auVar74);
    auVar70 = vminps_avx512vl(auVar70,auVar72);
    auVar72 = vmaxps_avx512vl(auVar73,auVar74);
    auVar71 = vmaxps_avx512vl(auVar71,auVar72);
    auVar72 = vminps_avx512vl(auVar79,auVar80);
    auVar73 = vmaxps_avx512vl(auVar79,auVar80);
    auVar74 = vminps_avx512vl(auVar81,auVar69);
    auVar72 = vminps_avx512vl(auVar72,auVar74);
    auVar70 = vminps_avx512vl(auVar70,auVar72);
    auVar69 = vmaxps_avx512vl(auVar81,auVar69);
    auVar69 = vmaxps_avx512vl(auVar73,auVar69);
    auVar69 = vmaxps_avx512vl(auVar71,auVar69);
    uVar15 = vcmpps_avx512vl(auVar70,local_78,2);
    uVar16 = vcmpps_avx512vl(auVar69,local_98,5);
    uVar31 = 0;
    bVar24 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar24 != 0) {
      auVar69 = vsubps_avx512vl(auVar75,auVar133);
      auVar70 = vsubps_avx512vl(auVar62,auVar134);
      auVar71 = vsubps_avx512vl(auVar61,auVar77);
      auVar69 = vaddps_avx512vl(auVar69,auVar71);
      auVar71 = vsubps_avx512vl(auVar67,auVar65);
      auVar70 = vaddps_avx512vl(auVar70,auVar71);
      auVar71 = vmulps_avx512vl(auVar134,auVar69);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar133);
      auVar66 = vmulps_avx512vl(auVar66,auVar69);
      auVar66 = vfnmadd213ps_avx512vl(auVar110,auVar70,auVar66);
      auVar63 = vmulps_avx512vl(auVar63,auVar69);
      auVar63 = vfnmadd213ps_avx512vl(auVar64,auVar70,auVar63);
      auVar64 = vmulps_avx512vl(auVar62,auVar69);
      auVar62 = vfnmadd231ps_avx512vl(auVar64,auVar70,auVar75);
      auVar64 = vmulps_avx512vl(auVar65,auVar69);
      auVar77 = vfnmadd231ps_avx512vl(auVar64,auVar70,auVar77);
      auVar64 = vmulps_avx512vl(auVar68,auVar69);
      auVar65 = vfnmadd213ps_avx512vl(auVar193,auVar70,auVar64);
      auVar64 = vmulps_avx512vl(auVar76,auVar69);
      auVar68 = vfnmadd213ps_avx512vl(auVar78,auVar70,auVar64);
      auVar64 = vmulps_avx512vl(auVar67,auVar69);
      auVar61 = vfnmadd231ps_avx512vl(auVar64,auVar61,auVar70);
      auVar78 = vminps_avx(auVar71,auVar66);
      auVar64 = vmaxps_avx(auVar71,auVar66);
      auVar75 = vminps_avx(auVar63,auVar62);
      auVar75 = vminps_avx(auVar78,auVar75);
      auVar78 = vmaxps_avx(auVar63,auVar62);
      auVar64 = vmaxps_avx(auVar64,auVar78);
      auVar76 = vminps_avx(auVar77,auVar65);
      auVar78 = vmaxps_avx(auVar77,auVar65);
      auVar77 = vminps_avx(auVar68,auVar61);
      auVar76 = vminps_avx(auVar76,auVar77);
      auVar76 = vminps_avx(auVar75,auVar76);
      auVar75 = vmaxps_avx(auVar68,auVar61);
      auVar78 = vmaxps_avx(auVar78,auVar75);
      auVar64 = vmaxps_avx(auVar64,auVar78);
      uVar15 = vcmpps_avx512vl(auVar64,local_98,5);
      uVar16 = vcmpps_avx512vl(auVar76,local_78,2);
      uVar31 = (uint)(bVar24 & (byte)uVar15 & (byte)uVar16);
    }
    if (uVar31 != 0) {
      auStack_2e8[uVar26] = uVar31;
      uVar15 = vmovlps_avx(auVar35);
      *(undefined8 *)(&uStack_148 + uVar26 * 2) = uVar15;
      uVar30 = vmovlps_avx512f(auVar53);
      auStack_58[uVar26] = uVar30;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar248 = ZEXT1664(auVar35);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM18 = ZEXT3264(auVar64);
    auVar249 = ZEXT464(0x3f800000);
    do {
      auVar35 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar26 == 0) {
        uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar20._4_4_ = uVar97;
        auVar20._0_4_ = uVar97;
        auVar20._8_4_ = uVar97;
        auVar20._12_4_ = uVar97;
        uVar15 = vcmpps_avx512vl(local_2a8,auVar20,2);
        uVar32 = (uint)uVar33 & (uint)uVar15;
        uVar33 = (ulong)uVar32;
        if (uVar32 == 0) {
          return;
        }
        goto LAB_01b7297e;
      }
      uVar25 = (int)uVar26 - 1;
      uVar27 = (ulong)uVar25;
      uVar31 = (&uStack_148)[uVar27 * 2];
      fVar212 = afStack_144[uVar27 * 2];
      uVar5 = auStack_2e8[uVar27];
      auVar189._8_8_ = 0;
      auVar189._0_8_ = auStack_58[uVar27];
      auVar194 = ZEXT1664(auVar189);
      lVar29 = 0;
      for (uVar30 = (ulong)uVar5; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar28 = uVar5 - 1 & uVar5;
      auStack_2e8[uVar27] = uVar28;
      if (uVar28 == 0) {
        uVar26 = (ulong)uVar25;
      }
      auVar115._0_4_ = (float)lVar29;
      auVar115._4_8_ = SUB128(ZEXT812(0),4);
      auVar115._12_4_ = 0;
      auVar43 = vmulss_avx512f(auVar115,SUB6416(ZEXT464(0x3e124925),0));
      lVar29 = lVar29 + 1;
      auVar42 = vmulss_avx512f(ZEXT416((uint)(float)lVar29),SUB6416(ZEXT464(0x3e124925),0));
      auVar36 = auVar249._0_16_;
      auVar38 = vsubss_avx512f(auVar36,auVar43);
      auVar43 = vmulss_avx512f(ZEXT416((uint)fVar212),auVar43);
      auVar38 = vfmadd231ss_avx512f(auVar43,ZEXT416(uVar31),auVar38);
      auVar43 = vsubss_avx512f(auVar36,auVar42);
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar42._0_4_)),ZEXT416(uVar31),auVar43);
      auVar42 = vsubss_avx512f(auVar43,auVar38);
      vucomiss_avx512f(auVar42);
      if (uVar5 == 0 || lVar29 == 0) break;
      auVar64._16_16_ = vshufps_avx(auVar189,auVar189,0x50);
      vucomiss_avx512f(auVar42);
      uVar31 = (uint)uVar26;
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar41 = vsubps_avx(auVar116,auVar64._16_16_);
      fVar212 = auVar64._16_4_;
      auVar129._0_4_ = fVar228 * fVar212;
      fVar195 = auVar64._20_4_;
      auVar129._4_4_ = fVar229 * fVar195;
      fVar208 = auVar64._24_4_;
      auVar129._8_4_ = fVar228 * fVar208;
      fVar209 = auVar64._28_4_;
      auVar129._12_4_ = fVar229 * fVar209;
      auVar138._0_4_ = fVar111 * fVar212;
      auVar138._4_4_ = fVar120 * fVar195;
      auVar138._8_4_ = fVar111 * fVar208;
      auVar138._12_4_ = fVar120 * fVar209;
      auVar147._0_4_ = fVar121 * fVar212;
      auVar147._4_4_ = fVar122 * fVar195;
      auVar147._8_4_ = fVar121 * fVar208;
      auVar147._12_4_ = fVar122 * fVar209;
      auVar105._0_4_ = fVar136 * fVar212;
      auVar105._4_4_ = fVar143 * fVar195;
      auVar105._8_4_ = fVar136 * fVar208;
      auVar105._12_4_ = fVar143 * fVar209;
      auVar64._16_16_ = vfmadd231ps_fma(auVar129,auVar41,local_2f8);
      auVar59 = vfmadd231ps_fma(auVar138,auVar41,local_308);
      auVar53 = vfmadd231ps_fma(auVar147,auVar41,local_318);
      auVar48 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar41);
      auVar71._16_16_ = auVar64._16_16_;
      auVar71._0_16_ = auVar64._16_16_;
      auVar134._16_16_ = auVar59;
      auVar134._0_16_ = auVar59;
      auVar142._16_16_ = auVar53;
      auVar142._0_16_ = auVar53;
      uVar97 = auVar38._0_4_;
      auVar162._4_4_ = uVar97;
      auVar162._0_4_ = uVar97;
      auVar162._8_4_ = uVar97;
      auVar162._12_4_ = uVar97;
      uVar97 = auVar43._0_4_;
      auVar162._20_4_ = uVar97;
      auVar162._16_4_ = uVar97;
      auVar162._24_4_ = uVar97;
      auVar162._28_4_ = uVar97;
      auVar64 = vsubps_avx(auVar134,auVar71);
      auVar41 = vfmadd213ps_fma(auVar64,auVar162,auVar71);
      auVar64 = vsubps_avx(auVar142,auVar134);
      auVar59 = vfmadd213ps_fma(auVar64,auVar162,auVar134);
      auVar64._16_16_ = vsubps_avx(auVar48,auVar53);
      auVar135._16_16_ = auVar64._16_16_;
      auVar135._0_16_ = auVar64._16_16_;
      auVar64._16_16_ = vfmadd213ps_fma(auVar135,auVar162,auVar142);
      auVar78 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar41));
      auVar41 = vfmadd213ps_fma(auVar78,auVar162,ZEXT1632(auVar41));
      auVar64 = vsubps_avx(ZEXT1632(auVar64._16_16_),ZEXT1632(auVar59));
      auVar64._16_16_ = vfmadd213ps_fma(auVar64,auVar162,ZEXT1632(auVar59));
      auVar64 = vsubps_avx(ZEXT1632(auVar64._16_16_),ZEXT1632(auVar41));
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar64,auVar162);
      auVar64 = vmulps_avx512vl(auVar64,in_ZMM18._0_32_);
      auVar41 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar212 = auVar41._0_4_;
      auVar148._0_8_ =
           CONCAT44(auVar58._4_4_ + fVar212 * auVar64._4_4_,auVar58._0_4_ + fVar212 * auVar64._0_4_)
      ;
      auVar148._8_4_ = auVar58._8_4_ + fVar212 * auVar64._8_4_;
      auVar148._12_4_ = auVar58._12_4_ + fVar212 * auVar64._12_4_;
      auVar130._0_4_ = fVar212 * auVar64._16_4_;
      auVar130._4_4_ = fVar212 * auVar64._20_4_;
      auVar130._8_4_ = fVar212 * auVar64._24_4_;
      auVar130._12_4_ = fVar212 * auVar64._28_4_;
      auVar51 = vsubps_avx((undefined1  [16])0x0,auVar130);
      auVar57 = vshufpd_avx(auVar58,auVar58,3);
      auVar54 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar41 = vsubps_avx(auVar57,auVar58);
      auVar59 = vsubps_avx(auVar54,(undefined1  [16])0x0);
      auVar165._0_4_ = auVar59._0_4_ + auVar41._0_4_;
      auVar165._4_4_ = auVar59._4_4_ + auVar41._4_4_;
      auVar165._8_4_ = auVar59._8_4_ + auVar41._8_4_;
      auVar165._12_4_ = auVar59._12_4_ + auVar41._12_4_;
      auVar41 = vshufps_avx(auVar58,auVar58,0xb1);
      auVar59 = vshufps_avx(auVar148,auVar148,0xb1);
      auVar53 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar221._4_4_ = auVar165._0_4_;
      auVar221._0_4_ = auVar165._0_4_;
      auVar221._8_4_ = auVar165._0_4_;
      auVar221._12_4_ = auVar165._0_4_;
      auVar55 = vshufps_avx(auVar165,auVar165,0x55);
      fVar212 = auVar55._0_4_;
      auVar179._0_4_ = auVar41._0_4_ * fVar212;
      fVar195 = auVar55._4_4_;
      auVar179._4_4_ = auVar41._4_4_ * fVar195;
      fVar208 = auVar55._8_4_;
      auVar179._8_4_ = auVar41._8_4_ * fVar208;
      fVar209 = auVar55._12_4_;
      auVar179._12_4_ = auVar41._12_4_ * fVar209;
      auVar190._0_4_ = auVar59._0_4_ * fVar212;
      auVar190._4_4_ = auVar59._4_4_ * fVar195;
      auVar190._8_4_ = auVar59._8_4_ * fVar208;
      auVar190._12_4_ = auVar59._12_4_ * fVar209;
      auVar198._0_4_ = auVar53._0_4_ * fVar212;
      auVar198._4_4_ = auVar53._4_4_ * fVar195;
      auVar198._8_4_ = auVar53._8_4_ * fVar208;
      auVar198._12_4_ = auVar53._12_4_ * fVar209;
      auVar166._0_4_ = auVar48._0_4_ * fVar212;
      auVar166._4_4_ = auVar48._4_4_ * fVar195;
      auVar166._8_4_ = auVar48._8_4_ * fVar208;
      auVar166._12_4_ = auVar48._12_4_ * fVar209;
      auVar41 = vfmadd231ps_fma(auVar179,auVar221,auVar58);
      auVar59 = vfmadd231ps_fma(auVar190,auVar221,auVar148);
      auVar55 = vfmadd231ps_fma(auVar198,auVar221,auVar51);
      auVar52 = vfmadd231ps_fma(auVar166,(undefined1  [16])0x0,auVar221);
      auVar56 = vshufpd_avx(auVar41,auVar41,1);
      auVar49 = vshufpd_avx(auVar59,auVar59,1);
      auVar50 = vshufpd_avx(auVar55,auVar55,1);
      auVar60 = vshufpd_avx(auVar52,auVar52,1);
      auVar53 = vminss_avx(auVar41,auVar59);
      auVar41 = vmaxss_avx(auVar59,auVar41);
      auVar48 = vminss_avx(auVar55,auVar52);
      auVar59 = vmaxss_avx(auVar52,auVar55);
      auVar48 = vminss_avx(auVar53,auVar48);
      auVar41 = vmaxss_avx(auVar59,auVar41);
      auVar55 = vminss_avx(auVar56,auVar49);
      auVar59 = vmaxss_avx(auVar49,auVar56);
      auVar56 = vminss_avx(auVar50,auVar60);
      auVar53 = vmaxss_avx(auVar60,auVar50);
      auVar55 = vminss_avx(auVar55,auVar56);
      auVar59 = vmaxss_avx(auVar53,auVar59);
      vucomiss_avx512f(auVar48);
      if ((uVar31 < 5) || (auVar59 = vucomiss_avx512f(auVar35), uVar31 < 5)) {
        auVar41 = vucomiss_avx512f(auVar35);
        uVar15 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar16 = vcmpps_avx512vl(auVar48,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar31 & ((byte)uVar16 | (byte)uVar15)) != 0) goto LAB_01b738c2;
        uVar15 = vcmpps_avx512vl(auVar35,auVar59,5);
        uVar16 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar16 | (ushort)uVar15) & 1) == 0) goto LAB_01b738c2;
LAB_01b7430e:
        bVar10 = true;
        auVar194 = ZEXT1664(auVar189);
      }
      else {
LAB_01b738c2:
        auVar56 = auVar252._0_16_;
        uVar15 = vcmpss_avx512f(auVar48,auVar56,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        iVar93 = auVar249._0_4_;
        fVar212 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar93);
        uVar15 = vcmpss_avx512f(auVar41,auVar56,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        fVar195 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar93);
        bVar10 = fVar212 != fVar195;
        iVar251 = auVar252._0_4_;
        auVar64._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar82._4_28_ = auVar64._4_28_;
        auVar82._0_4_ = (uint)bVar10 * iVar251 + (uint)!bVar10 * 0x7f800000;
        auVar53 = auVar82._0_16_;
        auVar84._16_16_ = auVar64._16_16_;
        auVar84._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar10 * iVar251 + (uint)!bVar10 * -0x800000;
        auVar35 = auVar83._0_16_;
        uVar15 = vcmpss_avx512f(auVar55,auVar56,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        fVar208 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar93);
        if ((fVar212 != fVar208) || (NAN(fVar212) || NAN(fVar208))) {
          fVar209 = auVar55._0_4_;
          fVar212 = auVar48._0_4_;
          bVar10 = fVar209 == fVar212;
          if ((!bVar10) || (NAN(fVar209) || NAN(fVar212))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar48 = vxorps_avx512vl(auVar48,auVar19);
            auVar243._0_4_ = auVar48._0_4_ / (fVar209 - fVar212);
            auVar243._4_12_ = auVar48._4_12_;
            auVar48 = vsubss_avx512f(auVar36,auVar243);
            auVar55 = vfmadd213ss_avx512f(auVar48,auVar56,auVar243);
            auVar48 = auVar55;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar86._16_16_ = auVar64._16_16_;
            auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ = (uint)bVar10 * iVar251 + (uint)!bVar10 * 0x7f800000;
            auVar55 = auVar85._0_16_;
            auVar48 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar53 = vminss_avx(auVar53,auVar55);
          auVar35 = vmaxss_avx(auVar48,auVar35);
        }
        uVar15 = vcmpss_avx512f(auVar59,auVar56,1);
        bVar10 = (bool)((byte)uVar15 & 1);
        fVar212 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar93);
        if ((fVar195 != fVar212) || (NAN(fVar195) || NAN(fVar212))) {
          fVar209 = auVar59._0_4_;
          fVar195 = auVar41._0_4_;
          bVar10 = fVar209 == fVar195;
          if ((!bVar10) || (NAN(fVar209) || NAN(fVar195))) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar41 = vxorps_avx512vl(auVar41,auVar18);
            auVar199._0_4_ = auVar41._0_4_ / (fVar209 - fVar195);
            auVar199._4_12_ = auVar41._4_12_;
            auVar41 = vsubss_avx512f(auVar36,auVar199);
            auVar59 = vfmadd213ss_avx512f(auVar41,auVar56,auVar199);
            auVar41 = auVar59;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar88._16_16_ = auVar64._16_16_;
            auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar87._4_28_ = auVar88._4_28_;
            auVar87._0_4_ = (uint)bVar10 * iVar251 + (uint)!bVar10 * 0x7f800000;
            auVar59 = auVar87._0_16_;
            auVar41 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar53 = vminss_avx(auVar53,auVar59);
          auVar35 = vmaxss_avx(auVar41,auVar35);
        }
        bVar10 = fVar208 != fVar212;
        auVar41 = vminss_avx512f(auVar53,auVar36);
        auVar90._16_16_ = auVar64._16_16_;
        auVar90._0_16_ = auVar53;
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar10 * auVar41._0_4_ + (uint)!bVar10 * auVar53._0_4_;
        auVar41 = vmaxss_avx512f(auVar36,auVar35);
        auVar92._16_16_ = auVar64._16_16_;
        auVar92._0_16_ = auVar35;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar10 * auVar41._0_4_ + (uint)!bVar10 * auVar35._0_4_;
        auVar35 = vmaxss_avx512f(auVar56,auVar89._0_16_);
        auVar41 = vminss_avx512f(auVar91._0_16_,auVar36);
        bVar10 = true;
        if (auVar41._0_4_ < auVar35._0_4_) goto LAB_01b7430e;
        auVar49 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar35._0_4_ + -0.1)));
        auVar50 = vminss_avx512f(ZEXT416((uint)(auVar41._0_4_ + 0.1)),auVar36);
        auVar106._0_8_ = auVar58._0_8_;
        auVar106._8_8_ = auVar106._0_8_;
        auVar191._8_8_ = auVar148._0_8_;
        auVar191._0_8_ = auVar148._0_8_;
        auVar200._8_8_ = auVar51._0_8_;
        auVar200._0_8_ = auVar51._0_8_;
        auVar35 = vshufpd_avx(auVar148,auVar148,3);
        auVar41 = vshufpd_avx(auVar51,auVar51,3);
        auVar59 = vshufps_avx(auVar49,auVar50,0);
        auVar222._8_4_ = 0x3f800000;
        auVar222._0_8_ = &DAT_3f8000003f800000;
        auVar222._12_4_ = 0x3f800000;
        auVar53 = vsubps_avx(auVar222,auVar59);
        fVar212 = auVar59._0_4_;
        auVar236._0_4_ = fVar212 * auVar57._0_4_;
        fVar195 = auVar59._4_4_;
        auVar236._4_4_ = fVar195 * auVar57._4_4_;
        fVar208 = auVar59._8_4_;
        auVar236._8_4_ = fVar208 * auVar57._8_4_;
        fVar209 = auVar59._12_4_;
        auVar236._12_4_ = fVar209 * auVar57._12_4_;
        auVar149._0_4_ = fVar212 * auVar35._0_4_;
        auVar149._4_4_ = fVar195 * auVar35._4_4_;
        auVar149._8_4_ = fVar208 * auVar35._8_4_;
        auVar149._12_4_ = fVar209 * auVar35._12_4_;
        auVar159._0_4_ = fVar212 * auVar41._0_4_;
        auVar159._4_4_ = fVar195 * auVar41._4_4_;
        auVar159._8_4_ = fVar208 * auVar41._8_4_;
        auVar159._12_4_ = fVar209 * auVar41._12_4_;
        auVar131._0_4_ = fVar212 * auVar54._0_4_;
        auVar131._4_4_ = fVar195 * auVar54._4_4_;
        auVar131._8_4_ = fVar208 * auVar54._8_4_;
        auVar131._12_4_ = fVar209 * auVar54._12_4_;
        auVar48 = vfmadd231ps_fma(auVar236,auVar53,auVar106);
        auVar55 = vfmadd231ps_fma(auVar149,auVar53,auVar191);
        auVar56 = vfmadd231ps_fma(auVar159,auVar53,auVar200);
        auVar57 = vfmadd231ps_fma(auVar131,auVar53,ZEXT816(0));
        auVar35 = vsubss_avx512f(auVar36,auVar49);
        auVar41 = vmovshdup_avx512vl(auVar189);
        auVar51 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar49._0_4_)),auVar189,
                                      auVar35);
        auVar35 = vsubss_avx512f(auVar36,auVar50);
        auVar52 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar50._0_4_ * auVar41._0_4_)),auVar189,
                                      auVar35);
        auVar53 = vdivss_avx512f(auVar36,auVar42);
        auVar35 = vsubps_avx(auVar55,auVar48);
        auVar117._0_4_ = auVar35._0_4_ * 3.0;
        auVar117._4_4_ = auVar35._4_4_ * 3.0;
        auVar117._8_4_ = auVar35._8_4_ * 3.0;
        auVar117._12_4_ = auVar35._12_4_ * 3.0;
        auVar35 = vsubps_avx(auVar56,auVar55);
        auVar167._0_4_ = auVar35._0_4_ * 3.0;
        auVar167._4_4_ = auVar35._4_4_ * 3.0;
        auVar167._8_4_ = auVar35._8_4_ * 3.0;
        auVar167._12_4_ = auVar35._12_4_ * 3.0;
        auVar35 = vsubps_avx(auVar57,auVar56);
        auVar180._0_4_ = auVar35._0_4_ * 3.0;
        auVar180._4_4_ = auVar35._4_4_ * 3.0;
        auVar180._8_4_ = auVar35._8_4_ * 3.0;
        auVar180._12_4_ = auVar35._12_4_ * 3.0;
        auVar42 = vminps_avx(auVar167,auVar180);
        auVar35 = vmaxps_avx(auVar167,auVar180);
        auVar42 = vminps_avx(auVar117,auVar42);
        auVar35 = vmaxps_avx(auVar117,auVar35);
        auVar41 = vshufpd_avx(auVar42,auVar42,3);
        auVar59 = vshufpd_avx(auVar35,auVar35,3);
        auVar42 = vminps_avx(auVar42,auVar41);
        auVar35 = vmaxps_avx(auVar35,auVar59);
        fVar212 = auVar53._0_4_;
        auVar181._0_4_ = fVar212 * auVar42._0_4_;
        auVar181._4_4_ = fVar212 * auVar42._4_4_;
        auVar181._8_4_ = fVar212 * auVar42._8_4_;
        auVar181._12_4_ = fVar212 * auVar42._12_4_;
        auVar168._0_4_ = fVar212 * auVar35._0_4_;
        auVar168._4_4_ = fVar212 * auVar35._4_4_;
        auVar168._8_4_ = fVar212 * auVar35._8_4_;
        auVar168._12_4_ = fVar212 * auVar35._12_4_;
        auVar54 = vdivss_avx512f(auVar36,ZEXT416((uint)(auVar52._0_4_ - auVar51._0_4_)));
        auVar35 = vshufpd_avx(auVar48,auVar48,3);
        auVar42 = vshufpd_avx(auVar55,auVar55,3);
        auVar41 = vshufpd_avx(auVar56,auVar56,3);
        auVar59 = vshufpd_avx(auVar57,auVar57,3);
        auVar35 = vsubps_avx(auVar35,auVar48);
        auVar53 = vsubps_avx(auVar42,auVar55);
        auVar48 = vsubps_avx(auVar41,auVar56);
        auVar59 = vsubps_avx(auVar59,auVar57);
        auVar42 = vminps_avx(auVar35,auVar53);
        auVar35 = vmaxps_avx(auVar35,auVar53);
        auVar41 = vminps_avx(auVar48,auVar59);
        auVar41 = vminps_avx(auVar42,auVar41);
        auVar42 = vmaxps_avx(auVar48,auVar59);
        auVar35 = vmaxps_avx(auVar35,auVar42);
        fVar212 = auVar54._0_4_;
        auVar201._0_4_ = fVar212 * auVar41._0_4_;
        auVar201._4_4_ = fVar212 * auVar41._4_4_;
        auVar201._8_4_ = fVar212 * auVar41._8_4_;
        auVar201._12_4_ = fVar212 * auVar41._12_4_;
        auVar214._0_4_ = fVar212 * auVar35._0_4_;
        auVar214._4_4_ = fVar212 * auVar35._4_4_;
        auVar214._8_4_ = fVar212 * auVar35._8_4_;
        auVar214._12_4_ = fVar212 * auVar35._12_4_;
        auVar60 = vinsertps_avx512f(auVar38,auVar51,0x10);
        auVar53 = vinsertps_avx(auVar43,auVar52,0x10);
        auVar96._0_4_ = auVar60._0_4_ + auVar53._0_4_;
        auVar96._4_4_ = auVar60._4_4_ + auVar53._4_4_;
        auVar96._8_4_ = auVar60._8_4_ + auVar53._8_4_;
        auVar96._12_4_ = auVar60._12_4_ + auVar53._12_4_;
        auVar49 = vmulps_avx512vl(auVar96,auVar248._0_16_);
        auVar41 = vshufps_avx(auVar49,auVar49,0x54);
        uVar97 = auVar49._0_4_;
        auVar118._4_4_ = uVar97;
        auVar118._0_4_ = uVar97;
        auVar118._8_4_ = uVar97;
        auVar118._12_4_ = uVar97;
        auVar48 = vfmadd213ps_avx512vl(auVar34,auVar118,auVar47);
        auVar42 = vfmadd213ps_fma(auVar45,auVar118,auVar46);
        auVar59 = vfmadd213ps_fma(local_158,auVar118,auVar44);
        auVar35 = vsubps_avx(auVar42,auVar48);
        auVar48 = vfmadd213ps_fma(auVar35,auVar118,auVar48);
        auVar35 = vsubps_avx(auVar59,auVar42);
        auVar35 = vfmadd213ps_fma(auVar35,auVar118,auVar42);
        auVar35 = vsubps_avx(auVar35,auVar48);
        auVar42 = vfmadd231ps_fma(auVar48,auVar35,auVar118);
        auVar119._0_8_ = CONCAT44(auVar35._4_4_ * 3.0,auVar35._0_4_ * 3.0);
        auVar119._8_4_ = auVar35._8_4_ * 3.0;
        auVar119._12_4_ = auVar35._12_4_ * 3.0;
        auVar223._8_8_ = auVar42._0_8_;
        auVar223._0_8_ = auVar42._0_8_;
        auVar35 = vshufpd_avx(auVar42,auVar42,3);
        auVar42 = vshufps_avx(auVar49,auVar49,0x55);
        auVar59 = vsubps_avx(auVar35,auVar223);
        auVar48 = vfmadd231ps_fma(auVar223,auVar42,auVar59);
        auVar244._8_8_ = auVar119._0_8_;
        auVar244._0_8_ = auVar119._0_8_;
        auVar35 = vshufpd_avx(auVar119,auVar119,3);
        auVar35 = vsubps_avx(auVar35,auVar244);
        auVar42 = vfmadd213ps_fma(auVar35,auVar42,auVar244);
        auVar55 = vxorps_avx512vl(auVar59,auVar253._0_16_);
        auVar35 = vmovshdup_avx(auVar42);
        auVar56 = vxorps_avx512vl(auVar35,auVar253._0_16_);
        auVar57 = vmovshdup_avx512vl(auVar59);
        auVar56 = vpermt2ps_avx512vl(auVar56,ZEXT416(5),auVar59);
        auVar35 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar35._0_4_ * auVar59._0_4_)),auVar42,auVar57
                                     );
        auVar42 = vpermt2ps_avx512vl(auVar42,SUB6416(ZEXT464(4),0),auVar55);
        auVar132._0_4_ = auVar35._0_4_;
        auVar132._4_4_ = auVar132._0_4_;
        auVar132._8_4_ = auVar132._0_4_;
        auVar132._12_4_ = auVar132._0_4_;
        auVar35 = vdivps_avx(auVar56,auVar132);
        auVar42 = vdivps_avx(auVar42,auVar132);
        fVar195 = auVar48._0_4_;
        auVar59 = vshufps_avx(auVar48,auVar48,0x55);
        fVar212 = auVar42._0_4_;
        auVar224._0_4_ = fVar195 * auVar35._0_4_ + auVar59._0_4_ * fVar212;
        auVar224._4_4_ = fVar195 * auVar35._4_4_ + auVar59._4_4_ * auVar42._4_4_;
        auVar224._8_4_ = fVar195 * auVar35._8_4_ + auVar59._8_4_ * auVar42._8_4_;
        auVar224._12_4_ = fVar195 * auVar35._12_4_ + auVar59._12_4_ * auVar42._12_4_;
        auVar50 = vsubps_avx(auVar41,auVar224);
        auVar48 = vmovshdup_avx(auVar35);
        auVar41 = vinsertps_avx(auVar181,auVar201,0x1c);
        auVar245._0_4_ = auVar48._0_4_ * auVar41._0_4_;
        auVar245._4_4_ = auVar48._4_4_ * auVar41._4_4_;
        auVar245._8_4_ = auVar48._8_4_ * auVar41._8_4_;
        auVar245._12_4_ = auVar48._12_4_ * auVar41._12_4_;
        auVar59 = vinsertps_avx(auVar168,auVar214,0x1c);
        auVar225._0_4_ = auVar48._0_4_ * auVar59._0_4_;
        auVar225._4_4_ = auVar48._4_4_ * auVar59._4_4_;
        auVar225._8_4_ = auVar48._8_4_ * auVar59._8_4_;
        auVar225._12_4_ = auVar48._12_4_ * auVar59._12_4_;
        auVar54 = vminps_avx512vl(auVar245,auVar225);
        auVar56 = vmaxps_avx(auVar225,auVar245);
        auVar57 = vmovshdup_avx(auVar42);
        auVar48 = vinsertps_avx(auVar201,auVar181,0x4c);
        auVar202._0_4_ = auVar57._0_4_ * auVar48._0_4_;
        auVar202._4_4_ = auVar57._4_4_ * auVar48._4_4_;
        auVar202._8_4_ = auVar57._8_4_ * auVar48._8_4_;
        auVar202._12_4_ = auVar57._12_4_ * auVar48._12_4_;
        auVar55 = vinsertps_avx(auVar214,auVar168,0x4c);
        auVar215._0_4_ = auVar57._0_4_ * auVar55._0_4_;
        auVar215._4_4_ = auVar57._4_4_ * auVar55._4_4_;
        auVar215._8_4_ = auVar57._8_4_ * auVar55._8_4_;
        auVar215._12_4_ = auVar57._12_4_ * auVar55._12_4_;
        auVar57 = vminps_avx(auVar202,auVar215);
        auVar54 = vaddps_avx512vl(auVar54,auVar57);
        auVar57 = vmaxps_avx(auVar215,auVar202);
        auVar203._0_4_ = auVar56._0_4_ + auVar57._0_4_;
        auVar203._4_4_ = auVar56._4_4_ + auVar57._4_4_;
        auVar203._8_4_ = auVar56._8_4_ + auVar57._8_4_;
        auVar203._12_4_ = auVar56._12_4_ + auVar57._12_4_;
        auVar216._8_8_ = 0x3f80000000000000;
        auVar216._0_8_ = 0x3f80000000000000;
        auVar56 = vsubps_avx(auVar216,auVar203);
        auVar57 = vsubps_avx(auVar216,auVar54);
        auVar54 = vsubps_avx(auVar60,auVar49);
        auVar49 = vsubps_avx(auVar53,auVar49);
        fVar211 = auVar54._0_4_;
        auVar246._0_4_ = fVar211 * auVar56._0_4_;
        fVar219 = auVar54._4_4_;
        auVar246._4_4_ = fVar219 * auVar56._4_4_;
        fVar230 = auVar54._8_4_;
        auVar246._8_4_ = fVar230 * auVar56._8_4_;
        fVar231 = auVar54._12_4_;
        auVar246._12_4_ = fVar231 * auVar56._12_4_;
        auVar58 = vbroadcastss_avx512vl(auVar35);
        auVar41 = vmulps_avx512vl(auVar58,auVar41);
        auVar59 = vmulps_avx512vl(auVar58,auVar59);
        auVar58 = vminps_avx512vl(auVar41,auVar59);
        auVar41 = vmaxps_avx(auVar59,auVar41);
        auVar182._0_4_ = fVar212 * auVar48._0_4_;
        auVar182._4_4_ = fVar212 * auVar48._4_4_;
        auVar182._8_4_ = fVar212 * auVar48._8_4_;
        auVar182._12_4_ = fVar212 * auVar48._12_4_;
        auVar169._0_4_ = fVar212 * auVar55._0_4_;
        auVar169._4_4_ = fVar212 * auVar55._4_4_;
        auVar169._8_4_ = fVar212 * auVar55._8_4_;
        auVar169._12_4_ = fVar212 * auVar55._12_4_;
        auVar59 = vminps_avx(auVar182,auVar169);
        auVar48 = vaddps_avx512vl(auVar58,auVar59);
        auVar55 = vmulps_avx512vl(auVar54,auVar57);
        fVar195 = auVar49._0_4_;
        auVar204._0_4_ = fVar195 * auVar56._0_4_;
        fVar208 = auVar49._4_4_;
        auVar204._4_4_ = fVar208 * auVar56._4_4_;
        fVar209 = auVar49._8_4_;
        auVar204._8_4_ = fVar209 * auVar56._8_4_;
        fVar210 = auVar49._12_4_;
        auVar204._12_4_ = fVar210 * auVar56._12_4_;
        auVar217._0_4_ = fVar195 * auVar57._0_4_;
        auVar217._4_4_ = fVar208 * auVar57._4_4_;
        auVar217._8_4_ = fVar209 * auVar57._8_4_;
        auVar217._12_4_ = fVar210 * auVar57._12_4_;
        auVar59 = vmaxps_avx(auVar169,auVar182);
        auVar170._0_4_ = auVar41._0_4_ + auVar59._0_4_;
        auVar170._4_4_ = auVar41._4_4_ + auVar59._4_4_;
        auVar170._8_4_ = auVar41._8_4_ + auVar59._8_4_;
        auVar170._12_4_ = auVar41._12_4_ + auVar59._12_4_;
        auVar183._8_8_ = 0x3f800000;
        auVar183._0_8_ = 0x3f800000;
        auVar41 = vsubps_avx(auVar183,auVar170);
        auVar59 = vsubps_avx(auVar183,auVar48);
        auVar237._0_4_ = fVar211 * auVar41._0_4_;
        auVar237._4_4_ = fVar219 * auVar41._4_4_;
        auVar237._8_4_ = fVar230 * auVar41._8_4_;
        auVar237._12_4_ = fVar231 * auVar41._12_4_;
        auVar226._0_4_ = fVar211 * auVar59._0_4_;
        auVar226._4_4_ = fVar219 * auVar59._4_4_;
        auVar226._8_4_ = fVar230 * auVar59._8_4_;
        auVar226._12_4_ = fVar231 * auVar59._12_4_;
        auVar171._0_4_ = fVar195 * auVar41._0_4_;
        auVar171._4_4_ = fVar208 * auVar41._4_4_;
        auVar171._8_4_ = fVar209 * auVar41._8_4_;
        auVar171._12_4_ = fVar210 * auVar41._12_4_;
        auVar184._0_4_ = fVar195 * auVar59._0_4_;
        auVar184._4_4_ = fVar208 * auVar59._4_4_;
        auVar184._8_4_ = fVar209 * auVar59._8_4_;
        auVar184._12_4_ = fVar210 * auVar59._12_4_;
        auVar41 = vminps_avx(auVar237,auVar226);
        auVar59 = vminps_avx(auVar171,auVar184);
        auVar48 = vminps_avx(auVar41,auVar59);
        auVar41 = vmaxps_avx(auVar226,auVar237);
        auVar59 = vmaxps_avx(auVar184,auVar171);
        auVar59 = vmaxps_avx(auVar59,auVar41);
        auVar56 = vminps_avx512vl(auVar246,auVar55);
        auVar41 = vminps_avx(auVar204,auVar217);
        auVar41 = vminps_avx(auVar56,auVar41);
        auVar41 = vhaddps_avx(auVar48,auVar41);
        auVar55 = vmaxps_avx512vl(auVar55,auVar246);
        auVar48 = vmaxps_avx(auVar217,auVar204);
        auVar48 = vmaxps_avx(auVar48,auVar55);
        auVar59 = vhaddps_avx(auVar59,auVar48);
        auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
        auVar59 = vshufps_avx(auVar59,auVar59,0xe8);
        auVar172._0_4_ = auVar41._0_4_ + auVar50._0_4_;
        auVar172._4_4_ = auVar41._4_4_ + auVar50._4_4_;
        auVar172._8_4_ = auVar41._8_4_ + auVar50._8_4_;
        auVar172._12_4_ = auVar41._12_4_ + auVar50._12_4_;
        auVar185._0_4_ = auVar59._0_4_ + auVar50._0_4_;
        auVar185._4_4_ = auVar59._4_4_ + auVar50._4_4_;
        auVar185._8_4_ = auVar59._8_4_ + auVar50._8_4_;
        auVar185._12_4_ = auVar59._12_4_ + auVar50._12_4_;
        auVar41 = vmaxps_avx(auVar60,auVar172);
        auVar59 = vminps_avx(auVar185,auVar53);
        uVar30 = vcmpps_avx512vl(auVar59,auVar41,1);
        auVar41 = vinsertps_avx(auVar51,auVar52,0x10);
        auVar194 = ZEXT1664(auVar41);
        auVar59 = ZEXT416(5);
        if ((uVar30 & 3) == 0) {
          vucomiss_avx512f(auVar38);
          auVar59 = vxorps_avx512vl(auVar59,auVar59);
          auVar252 = ZEXT1664(auVar59);
          if (uVar31 < 4 && (uVar5 == 0 || lVar29 == 0)) {
            bVar10 = false;
          }
          else {
            lVar29 = 200;
            do {
              auVar53 = vsubss_avx512f(auVar36,auVar50);
              fVar209 = auVar53._0_4_;
              fVar195 = fVar209 * fVar209 * fVar209;
              fVar210 = auVar50._0_4_;
              fVar208 = fVar210 * 3.0 * fVar209 * fVar209;
              fVar209 = fVar209 * fVar210 * fVar210 * 3.0;
              auVar150._4_4_ = fVar195;
              auVar150._0_4_ = fVar195;
              auVar150._8_4_ = fVar195;
              auVar150._12_4_ = fVar195;
              auVar139._4_4_ = fVar208;
              auVar139._0_4_ = fVar208;
              auVar139._8_4_ = fVar208;
              auVar139._12_4_ = fVar208;
              auVar107._4_4_ = fVar209;
              auVar107._0_4_ = fVar209;
              auVar107._8_4_ = fVar209;
              auVar107._12_4_ = fVar209;
              fVar210 = fVar210 * fVar210 * fVar210;
              auVar160._0_4_ = (float)local_328._0_4_ * fVar210;
              auVar160._4_4_ = (float)local_328._4_4_ * fVar210;
              auVar160._8_4_ = fStack_320 * fVar210;
              auVar160._12_4_ = fStack_31c * fVar210;
              auVar53 = vfmadd231ps_fma(auVar160,auVar44,auVar107);
              auVar53 = vfmadd231ps_fma(auVar53,auVar46,auVar139);
              auVar53 = vfmadd231ps_fma(auVar53,auVar47,auVar150);
              auVar108._8_8_ = auVar53._0_8_;
              auVar108._0_8_ = auVar53._0_8_;
              auVar53 = vshufpd_avx(auVar53,auVar53,3);
              auVar48 = vshufps_avx(auVar50,auVar50,0x55);
              auVar53 = vsubps_avx(auVar53,auVar108);
              auVar48 = vfmadd213ps_fma(auVar53,auVar48,auVar108);
              fVar195 = auVar48._0_4_;
              auVar53 = vshufps_avx(auVar48,auVar48,0x55);
              auVar109._0_4_ = auVar35._0_4_ * fVar195 + fVar212 * auVar53._0_4_;
              auVar109._4_4_ = auVar35._4_4_ * fVar195 + auVar42._4_4_ * auVar53._4_4_;
              auVar109._8_4_ = auVar35._8_4_ * fVar195 + auVar42._8_4_ * auVar53._8_4_;
              auVar109._12_4_ = auVar35._12_4_ * fVar195 + auVar42._12_4_ * auVar53._12_4_;
              auVar50 = vsubps_avx(auVar50,auVar109);
              auVar53 = vandps_avx512vl(auVar48,auVar250._0_16_);
              auVar48 = vprolq_avx512vl(auVar53,0x20);
              auVar53 = vmaxss_avx(auVar48,auVar53);
              bVar13 = auVar53._0_4_ <= (float)local_338._0_4_;
              if (auVar53._0_4_ < (float)local_338._0_4_) {
                auVar35 = vucomiss_avx512f(auVar59);
                if (bVar13) {
                  auVar42 = vucomiss_avx512f(auVar35);
                  auVar249 = ZEXT1664(auVar42);
                  if (bVar13) {
                    vmovshdup_avx(auVar35);
                    auVar42 = vucomiss_avx512f(auVar59);
                    if (bVar13) {
                      auVar36 = vucomiss_avx512f(auVar42);
                      auVar249 = ZEXT1664(auVar36);
                      if (bVar13) {
                        auVar53 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar50 = vinsertps_avx(auVar53,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar53 = vdpps_avx(auVar50,local_168,0x7f);
                        auVar48 = vdpps_avx(auVar50,local_178,0x7f);
                        auVar55 = vdpps_avx(auVar50,local_188,0x7f);
                        auVar56 = vdpps_avx(auVar50,local_198,0x7f);
                        auVar57 = vdpps_avx(auVar50,local_1a8,0x7f);
                        auVar54 = vdpps_avx(auVar50,local_1b8,0x7f);
                        auVar49 = vdpps_avx(auVar50,local_1c8,0x7f);
                        auVar50 = vdpps_avx(auVar50,local_1d8,0x7f);
                        auVar60 = vsubss_avx512f(auVar36,auVar42);
                        fVar209 = auVar42._0_4_;
                        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar57._0_4_)),auVar60,
                                                  auVar53);
                        auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar209)),auVar60,
                                                  auVar48);
                        auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar209)),auVar60,
                                                  auVar55);
                        auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar50._0_4_)),auVar60,
                                                  auVar56);
                        auVar36 = vsubss_avx512f(auVar36,auVar35);
                        auVar192._0_4_ = auVar36._0_4_;
                        fVar212 = auVar192._0_4_ * auVar192._0_4_ * auVar192._0_4_;
                        local_f8 = auVar35._0_4_;
                        fVar195 = local_f8 * 3.0 * auVar192._0_4_ * auVar192._0_4_;
                        fVar208 = auVar192._0_4_ * local_f8 * local_f8 * 3.0;
                        fVar211 = local_f8 * local_f8 * local_f8;
                        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar55._0_4_)),
                                                  ZEXT416((uint)fVar208),auVar48);
                        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar195),auVar53);
                        auVar42 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar212),auVar42);
                        fVar210 = auVar42._0_4_;
                        if ((fVar94 <= fVar210) &&
                           (fVar219 = *(float *)(ray + k * 4 + 0x80), fVar210 <= fVar219)) {
                          local_e8 = vshufps_avx(auVar35,auVar35,0x55);
                          auVar186._8_4_ = 0x3f800000;
                          auVar186._0_8_ = &DAT_3f8000003f800000;
                          auVar186._12_4_ = 0x3f800000;
                          auVar35 = vsubps_avx(auVar186,local_e8);
                          fVar230 = local_e8._0_4_;
                          auVar205._0_4_ = fVar230 * (float)local_1f8._0_4_;
                          fVar231 = local_e8._4_4_;
                          auVar205._4_4_ = fVar231 * (float)local_1f8._4_4_;
                          fVar240 = local_e8._8_4_;
                          auVar205._8_4_ = fVar240 * fStack_1f0;
                          fVar241 = local_e8._12_4_;
                          auVar205._12_4_ = fVar241 * fStack_1ec;
                          auVar218._0_4_ = fVar230 * (float)local_248._0_4_;
                          auVar218._4_4_ = fVar231 * (float)local_248._4_4_;
                          auVar218._8_4_ = fVar240 * fStack_240;
                          auVar218._12_4_ = fVar241 * fStack_23c;
                          auVar227._0_4_ = fVar230 * (float)local_258._0_4_;
                          auVar227._4_4_ = fVar231 * (float)local_258._4_4_;
                          auVar227._8_4_ = fVar240 * fStack_250;
                          auVar227._12_4_ = fVar241 * fStack_24c;
                          auVar238._0_4_ = fVar230 * (float)local_218._0_4_;
                          auVar238._4_4_ = fVar231 * (float)local_218._4_4_;
                          auVar238._8_4_ = fVar240 * fStack_210;
                          auVar238._12_4_ = fVar241 * fStack_20c;
                          auVar42 = vfmadd231ps_fma(auVar205,auVar35,local_1e8);
                          auVar36 = vfmadd231ps_fma(auVar218,auVar35,local_228);
                          auVar53 = vfmadd231ps_fma(auVar227,auVar35,local_238);
                          auVar48 = vfmadd231ps_fma(auVar238,auVar35,local_208);
                          auVar35 = vsubps_avx(auVar36,auVar42);
                          auVar42 = vsubps_avx(auVar53,auVar36);
                          auVar36 = vsubps_avx(auVar48,auVar53);
                          auVar239._0_4_ = local_f8 * auVar42._0_4_;
                          auVar239._4_4_ = local_f8 * auVar42._4_4_;
                          auVar239._8_4_ = local_f8 * auVar42._8_4_;
                          auVar239._12_4_ = local_f8 * auVar42._12_4_;
                          auVar192._4_4_ = auVar192._0_4_;
                          auVar192._8_4_ = auVar192._0_4_;
                          auVar192._12_4_ = auVar192._0_4_;
                          auVar35 = vfmadd231ps_fma(auVar239,auVar192,auVar35);
                          auVar206._0_4_ = local_f8 * auVar36._0_4_;
                          auVar206._4_4_ = local_f8 * auVar36._4_4_;
                          auVar206._8_4_ = local_f8 * auVar36._8_4_;
                          auVar206._12_4_ = local_f8 * auVar36._12_4_;
                          auVar42 = vfmadd231ps_fma(auVar206,auVar192,auVar42);
                          auVar207._0_4_ = local_f8 * auVar42._0_4_;
                          auVar207._4_4_ = local_f8 * auVar42._4_4_;
                          auVar207._8_4_ = local_f8 * auVar42._8_4_;
                          auVar207._12_4_ = local_f8 * auVar42._12_4_;
                          auVar35 = vfmadd231ps_fma(auVar207,auVar192,auVar35);
                          auVar17._8_4_ = 0x40400000;
                          auVar17._0_8_ = 0x4040000040400000;
                          auVar17._12_4_ = 0x40400000;
                          auVar35 = vmulps_avx512vl(auVar35,auVar17);
                          pGVar6 = (context->scene->geometries).items[uVar32].ptr;
                          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            auVar173._0_4_ = fVar211 * (float)local_298._0_4_;
                            auVar173._4_4_ = fVar211 * (float)local_298._4_4_;
                            auVar173._8_4_ = fVar211 * fStack_290;
                            auVar173._12_4_ = fVar211 * fStack_28c;
                            auVar161._4_4_ = fVar208;
                            auVar161._0_4_ = fVar208;
                            auVar161._8_4_ = fVar208;
                            auVar161._12_4_ = fVar208;
                            auVar42 = vfmadd132ps_fma(auVar161,auVar173,local_288);
                            auVar151._4_4_ = fVar195;
                            auVar151._0_4_ = fVar195;
                            auVar151._8_4_ = fVar195;
                            auVar151._12_4_ = fVar195;
                            auVar42 = vfmadd132ps_fma(auVar151,auVar42,local_278);
                            auVar140._4_4_ = fVar212;
                            auVar140._0_4_ = fVar212;
                            auVar140._8_4_ = fVar212;
                            auVar140._12_4_ = fVar212;
                            auVar53 = vfmadd132ps_fma(auVar140,auVar42,local_268);
                            auVar42 = vshufps_avx(auVar53,auVar53,0xc9);
                            auVar36 = vshufps_avx(auVar35,auVar35,0xc9);
                            auVar141._0_4_ = auVar53._0_4_ * auVar36._0_4_;
                            auVar141._4_4_ = auVar53._4_4_ * auVar36._4_4_;
                            auVar141._8_4_ = auVar53._8_4_ * auVar36._8_4_;
                            auVar141._12_4_ = auVar53._12_4_ * auVar36._12_4_;
                            auVar35 = vfmsub231ps_fma(auVar141,auVar35,auVar42);
                            local_108 = auVar35._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar210;
                              uVar97 = vextractps_avx(auVar35,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar97;
                              uVar97 = vextractps_avx(auVar35,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar97;
                              *(undefined4 *)(ray + k * 4 + 0xe0) = local_108;
                              *(float *)(ray + k * 4 + 0xf0) = local_f8;
                              *(float *)(ray + k * 4 + 0x100) = fVar209;
                              *(uint *)(ray + k * 4 + 0x110) = uVar4;
                              *(uint *)(ray + k * 4 + 0x120) = uVar32;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              auVar42 = vshufps_avx(auVar35,auVar35,0x55);
                              local_118 = vshufps_avx(auVar35,auVar35,0xaa);
                              local_128[0] = (RTCHitN)auVar42[0];
                              local_128[1] = (RTCHitN)auVar42[1];
                              local_128[2] = (RTCHitN)auVar42[2];
                              local_128[3] = (RTCHitN)auVar42[3];
                              local_128[4] = (RTCHitN)auVar42[4];
                              local_128[5] = (RTCHitN)auVar42[5];
                              local_128[6] = (RTCHitN)auVar42[6];
                              local_128[7] = (RTCHitN)auVar42[7];
                              local_128[8] = (RTCHitN)auVar42[8];
                              local_128[9] = (RTCHitN)auVar42[9];
                              local_128[10] = (RTCHitN)auVar42[10];
                              local_128[0xb] = (RTCHitN)auVar42[0xb];
                              local_128[0xc] = (RTCHitN)auVar42[0xc];
                              local_128[0xd] = (RTCHitN)auVar42[0xd];
                              local_128[0xe] = (RTCHitN)auVar42[0xe];
                              local_128[0xf] = (RTCHitN)auVar42[0xf];
                              uStack_104 = local_108;
                              uStack_100 = local_108;
                              uStack_fc = local_108;
                              fStack_f4 = local_f8;
                              fStack_f0 = local_f8;
                              fStack_ec = local_f8;
                              local_d8 = local_2c8._0_8_;
                              uStack_d0 = local_2c8._8_8_;
                              local_c8 = local_2b8;
                              vpcmpeqd_avx2(ZEXT1632(local_2b8),ZEXT1632(local_2b8));
                              uStack_b4 = context->user->instID[0];
                              local_b8 = uStack_b4;
                              uStack_b0 = uStack_b4;
                              uStack_ac = uStack_b4;
                              uStack_a8 = context->user->instPrimID[0];
                              uStack_a4 = uStack_a8;
                              uStack_a0 = uStack_a8;
                              uStack_9c = uStack_a8;
                              *(float *)(ray + k * 4 + 0x80) = fVar210;
                              local_378 = local_2d8._0_8_;
                              uStack_370 = local_2d8._8_8_;
                              local_368.valid = (int *)&local_378;
                              local_368.geometryUserPtr = pGVar6->userPtr;
                              local_368.context = context->user;
                              local_368.hit = local_128;
                              local_368.N = 4;
                              local_368.ray = (RTCRayN *)ray;
                              if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->intersectionFilterN)(&local_368);
                                auVar35 = vxorps_avx512vl(auVar59,auVar59);
                                auVar252 = ZEXT1664(auVar35);
                                auVar249 = ZEXT464(0x3f800000);
                                auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM18 = ZEXT3264(auVar64);
                                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar248 = ZEXT1664(auVar35);
                                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar253 = ZEXT1664(auVar35);
                                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar250 = ZEXT1664(auVar35);
                              }
                              auVar35 = auVar252._0_16_;
                              auVar22._8_8_ = uStack_370;
                              auVar22._0_8_ = local_378;
                              uVar30 = vptestmd_avx512vl(auVar22,auVar22);
                              if ((uVar30 & 0xf) != 0) {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)(&local_368);
                                  auVar35 = vxorps_avx512vl(auVar35,auVar35);
                                  auVar252 = ZEXT1664(auVar35);
                                  auVar249 = ZEXT464(0x3f800000);
                                  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM18 = ZEXT3264(auVar64);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar248 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar253 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar250 = ZEXT1664(auVar35);
                                }
                                auVar23._8_8_ = uStack_370;
                                auVar23._0_8_ = local_378;
                                uVar30 = vptestmd_avx512vl(auVar23,auVar23);
                                uVar30 = uVar30 & 0xf;
                                bVar24 = (byte)uVar30;
                                if (bVar24 != 0) {
                                  iVar93 = *(int *)(local_368.hit + 4);
                                  iVar251 = *(int *)(local_368.hit + 8);
                                  iVar21 = *(int *)(local_368.hit + 0xc);
                                  bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                                  bVar12 = SUB81(uVar30 >> 3,0);
                                  *(uint *)(local_368.ray + 0xc0) =
                                       (uint)(bVar24 & 1) * *(int *)local_368.hit |
                                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_368.ray + 0xc0);
                                  *(uint *)(local_368.ray + 0xc4) =
                                       (uint)bVar13 * iVar93 |
                                       (uint)!bVar13 * *(int *)(local_368.ray + 0xc4);
                                  *(uint *)(local_368.ray + 200) =
                                       (uint)bVar11 * iVar251 |
                                       (uint)!bVar11 * *(int *)(local_368.ray + 200);
                                  *(uint *)(local_368.ray + 0xcc) =
                                       (uint)bVar12 * iVar21 |
                                       (uint)!bVar12 * *(int *)(local_368.ray + 0xcc);
                                  iVar93 = *(int *)(local_368.hit + 0x14);
                                  iVar251 = *(int *)(local_368.hit + 0x18);
                                  iVar21 = *(int *)(local_368.hit + 0x1c);
                                  bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                                  bVar12 = SUB81(uVar30 >> 3,0);
                                  *(uint *)(local_368.ray + 0xd0) =
                                       (uint)(bVar24 & 1) * *(int *)(local_368.hit + 0x10) |
                                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_368.ray + 0xd0);
                                  *(uint *)(local_368.ray + 0xd4) =
                                       (uint)bVar13 * iVar93 |
                                       (uint)!bVar13 * *(int *)(local_368.ray + 0xd4);
                                  *(uint *)(local_368.ray + 0xd8) =
                                       (uint)bVar11 * iVar251 |
                                       (uint)!bVar11 * *(int *)(local_368.ray + 0xd8);
                                  *(uint *)(local_368.ray + 0xdc) =
                                       (uint)bVar12 * iVar21 |
                                       (uint)!bVar12 * *(int *)(local_368.ray + 0xdc);
                                  iVar93 = *(int *)(local_368.hit + 0x24);
                                  iVar251 = *(int *)(local_368.hit + 0x28);
                                  iVar21 = *(int *)(local_368.hit + 0x2c);
                                  bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                                  bVar12 = SUB81(uVar30 >> 3,0);
                                  *(uint *)(local_368.ray + 0xe0) =
                                       (uint)(bVar24 & 1) * *(int *)(local_368.hit + 0x20) |
                                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_368.ray + 0xe0);
                                  *(uint *)(local_368.ray + 0xe4) =
                                       (uint)bVar13 * iVar93 |
                                       (uint)!bVar13 * *(int *)(local_368.ray + 0xe4);
                                  *(uint *)(local_368.ray + 0xe8) =
                                       (uint)bVar11 * iVar251 |
                                       (uint)!bVar11 * *(int *)(local_368.ray + 0xe8);
                                  *(uint *)(local_368.ray + 0xec) =
                                       (uint)bVar12 * iVar21 |
                                       (uint)!bVar12 * *(int *)(local_368.ray + 0xec);
                                  iVar93 = *(int *)(local_368.hit + 0x34);
                                  iVar251 = *(int *)(local_368.hit + 0x38);
                                  iVar21 = *(int *)(local_368.hit + 0x3c);
                                  bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                                  bVar12 = SUB81(uVar30 >> 3,0);
                                  *(uint *)(local_368.ray + 0xf0) =
                                       (uint)(bVar24 & 1) * *(int *)(local_368.hit + 0x30) |
                                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_368.ray + 0xf0);
                                  *(uint *)(local_368.ray + 0xf4) =
                                       (uint)bVar13 * iVar93 |
                                       (uint)!bVar13 * *(int *)(local_368.ray + 0xf4);
                                  *(uint *)(local_368.ray + 0xf8) =
                                       (uint)bVar11 * iVar251 |
                                       (uint)!bVar11 * *(int *)(local_368.ray + 0xf8);
                                  *(uint *)(local_368.ray + 0xfc) =
                                       (uint)bVar12 * iVar21 |
                                       (uint)!bVar12 * *(int *)(local_368.ray + 0xfc);
                                  iVar93 = *(int *)(local_368.hit + 0x44);
                                  iVar251 = *(int *)(local_368.hit + 0x48);
                                  iVar21 = *(int *)(local_368.hit + 0x4c);
                                  bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                                  bVar12 = SUB81(uVar30 >> 3,0);
                                  *(uint *)(local_368.ray + 0x100) =
                                       (uint)(bVar24 & 1) * *(int *)(local_368.hit + 0x40) |
                                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_368.ray + 0x100);
                                  *(uint *)(local_368.ray + 0x104) =
                                       (uint)bVar13 * iVar93 |
                                       (uint)!bVar13 * *(int *)(local_368.ray + 0x104);
                                  *(uint *)(local_368.ray + 0x108) =
                                       (uint)bVar11 * iVar251 |
                                       (uint)!bVar11 * *(int *)(local_368.ray + 0x108);
                                  *(uint *)(local_368.ray + 0x10c) =
                                       (uint)bVar12 * iVar21 |
                                       (uint)!bVar12 * *(int *)(local_368.ray + 0x10c);
                                  auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                                (local_368.hit + 0x50));
                                  *(undefined1 (*) [16])(local_368.ray + 0x110) = auVar35;
                                  auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                                (local_368.hit + 0x60));
                                  *(undefined1 (*) [16])(local_368.ray + 0x120) = auVar35;
                                  auVar35 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                                (local_368.hit + 0x70));
                                  *(undefined1 (*) [16])(local_368.ray + 0x130) = auVar35;
                                  auVar35 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                                (local_368.hit + 0x80));
                                  *(undefined1 (*) [16])(local_368.ray + 0x140) = auVar35;
                                  goto LAB_01b742a5;
                                }
                              }
                              *(float *)(ray + k * 4 + 0x80) = fVar219;
                            }
LAB_01b742a5:
                            auVar194 = ZEXT1664(auVar41);
                            goto LAB_01b742ca;
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar29 = lVar29 + -1;
            } while (lVar29 != 0);
          }
          auVar194 = ZEXT1664(auVar41);
        }
        else {
          auVar35 = vxorps_avx512vl(ZEXT416(5),auVar59);
          auVar252 = ZEXT1664(auVar35);
        }
      }
LAB_01b742ca:
    } while (bVar10);
    auVar35 = vinsertps_avx512f(auVar38,auVar43,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }